

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

fdb_compact_decision
cb_snapshot(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
           uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  bool bVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  fdb_compact_decision extraout_EAX;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ulong extraout_RAX;
  size_t sVar7;
  size_t sVar8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle_00;
  __atomic_base<unsigned_long> metalen;
  uint extraout_EDX;
  long extraout_RDX;
  fdb_kvs_handle *pfVar9;
  code *pcVar10;
  fdb_doc *ptr_handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar11;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 fconfig;
  timeval *ptVar12;
  timeval *__tv;
  fdb_config *fconfig_00;
  fdb_kvs_handle **ppfVar13;
  uint uVar14;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *__s;
  long lVar16;
  char *__s_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar17;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar18;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar19;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar20;
  uint uVar21;
  fdb_file_handle *pfVar22;
  fdb_kvs_config *pfVar23;
  fdb_kvs_handle **ppfVar24;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 unaff_R13;
  btree *doc_00;
  char cVar25;
  long lVar26;
  char *pcVar27;
  fdb_kvs_config *config;
  char *pcVar28;
  uint *puVar29;
  fdb_config *fconfig_01;
  fdb_kvs_handle **ppfVar30;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar31;
  char *pcVar32;
  fdb_doc *doc_01;
  fdb_doc *pfVar33;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 doc_02;
  fdb_kvs_handle *pfVar34;
  fdb_kvs_handle *pfStack_5270;
  fdb_kvs_handle *pfStack_5268;
  fdb_file_handle *pfStack_5260;
  fdb_iterator *pfStack_5258;
  fdb_doc *pfStack_5250;
  fdb_kvs_handle *pfStack_5248;
  timeval tStack_5240;
  fdb_kvs_config fStack_5230;
  fdb_config fStack_5218;
  fdb_config *pfStack_5120;
  fdb_kvs_handle *pfStack_5118;
  fdb_kvs_handle *pfStack_5110;
  fdb_file_handle *pfStack_5108;
  fdb_kvs_handle *pfStack_5100;
  char acStack_50f7 [15];
  filemgr *pfStack_50e8;
  docio_handle *pdStack_50e0;
  btreeblk_handle *pbStack_50d8;
  size_t sStack_50d0;
  filemgr *pfStack_50c8;
  docio_handle *pdStack_50c0;
  btreeblk_handle *pbStack_50b8;
  timeval tStack_50b0;
  undefined1 auStack_50a0 [76];
  uint uStack_5054;
  char *pcStack_4f60;
  atomic<unsigned_long> aStack_4f58;
  btree *pbStack_4f50;
  fdb_kvs_handle *pfStack_4f48;
  fdb_kvs_handle *pfStack_4f40;
  code *pcStack_4f38;
  uint uStack_4f24;
  fdb_txn *pfStack_4f20;
  fdb_kvs_handle *pfStack_4f18;
  fdb_iterator *pfStack_4f10;
  fdb_snapshot_info_t *pfStack_4f08;
  int iStack_4efc;
  fdb_kvs_handle *pfStack_4ef8;
  fdb_kvs_handle *apfStack_4ef0 [3];
  uint64_t uStack_4ed8;
  fdb_kvs_config fStack_4ed0;
  char acStack_4eb8 [8];
  timeval tStack_4eb0;
  char acStack_4ea0 [256];
  btree bStack_4da0;
  char acStack_4d50 [256];
  char acStack_4c50 [256];
  fdb_config fStack_4b50;
  fdb_kvs_handle **ppfStack_4a58;
  fdb_kvs_handle **ppfStack_4a50;
  fdb_kvs_handle *pfStack_4a48;
  fdb_kvs_handle **ppfStack_4a40;
  fdb_kvs_handle *pfStack_4a38;
  code *pcStack_4a30;
  fdb_kvs_handle **ppfStack_4a28;
  fdb_kvs_handle *pfStack_4a20;
  fdb_kvs_handle *apfStack_4a18 [9];
  fdb_kvs_config fStack_49d0;
  timeval tStack_49b8;
  fdb_kvs_handle *apfStack_49a8 [33];
  fdb_config fStack_48a0;
  fdb_kvs_handle *apfStack_47a8 [32];
  fdb_kvs_handle *apfStack_46a8 [32];
  fdb_kvs_handle afStack_45a8 [15];
  fdb_config *pfStack_25a0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2598;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2590;
  fdb_config *pfStack_2588;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2580;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2578;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2568;
  fdb_file_handle *pfStack_2560;
  fdb_iterator *pfStack_2558;
  fdb_doc *pfStack_2550;
  fdb_kvs_handle *pfStack_2548;
  undefined1 auStack_253f [15];
  timeval tStack_2530;
  undefined1 auStack_2520 [72];
  fdb_config fStack_24d8;
  timeval *ptStack_23e0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_23d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_23d0;
  fdb_config *pfStack_23c8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_23c0;
  int iStack_23ac;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_23a8;
  fdb_file_handle *pfStack_23a0;
  pthread_t pStack_2398;
  char acStack_238f [15];
  void *pvStack_2380;
  char *pcStack_2378;
  fdb_config *pfStack_2370;
  uint64_t uStack_2368;
  timeval tStack_2360;
  undefined1 auStack_2350 [16];
  uint64_t uStack_2340;
  fdb_config fStack_2258;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2158;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2150;
  uint *puStack_2148;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2140;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2138;
  timeval tStack_2128;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2118;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2110;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2100;
  fdb_kvs_handle *pfStack_20f8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_20f0;
  fdb_file_handle *pfStack_20e8;
  uint uStack_20dc;
  fdb_kvs_config afStack_20d8 [2];
  timeval tStack_2098;
  fdb_kvs_config fStack_2088;
  fdb_kvs_info fStack_2068;
  undefined1 auStack_2038 [32];
  undefined1 uStack_2018;
  undefined1 uStack_200a;
  undefined8 uStack_2000;
  code *pcStack_1fe0;
  undefined4 uStack_1fd8;
  uint *puStack_1fd0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1f40;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1f38;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1f30;
  hbtrie_func_readkey *phStack_1f28;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1f20;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1f18;
  fdb_file_handle *pfStack_1f08;
  uint uStack_1efc;
  fdb_kvs_handle *pfStack_1ef8;
  fdb_kvs_handle *pfStack_1ef0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1ee8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_1ee0 [5];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1eb8;
  char acStack_1eb0 [8];
  fdb_kvs_config fStack_1ea8;
  fdb_kvs_info fStack_1e90;
  timeval tStack_1e60;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_1e50 [5];
  btree *apbStack_1e28 [5];
  btree *apbStack_1e00 [5];
  btree *apbStack_1dd8 [4];
  fdb_doc *pfStack_1db8;
  char acStack_1db0 [256];
  char acStack_1cb0 [256];
  char acStack_1bb0 [256];
  fdb_config fStack_1ab0;
  fdb_doc *pfStack_19b8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_19b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_19a8;
  fdb_kvs_config *pfStack_19a0;
  fdb_doc *pfStack_1998;
  code *pcStack_1990;
  undefined1 auStack_1978 [36];
  undefined4 uStack_1954;
  fdb_kvs_handle *pfStack_1950;
  fdb_doc **ppfStack_1948;
  timeval tStack_1940;
  fdb_kvs_config fStack_1930;
  fdb_doc afStack_1918 [3];
  char acStack_1818 [256];
  char acStack_1718 [264];
  fdb_config fStack_1610;
  fdb_doc *pfStack_1518;
  size_t *psStack_1510;
  fdb_doc afStack_1068 [15];
  fdb_kvs_handle *pfStack_bb0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ba8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ba0;
  char *pcStack_b98;
  char *pcStack_b90;
  code *pcStack_b88;
  fdb_kvs_handle *pfStack_b78;
  int iStack_b6c;
  fdb_kvs_handle *pfStack_b68;
  undefined1 auStack_b60 [232];
  char acStack_a78 [8];
  char acStack_a70 [64];
  timeval tStack_a30;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_a20 [5];
  btree *apbStack_9f8 [5];
  btree *apbStack_9d0 [5];
  btree *apbStack_9a8 [5];
  fdb_config fStack_980;
  fdb_kvs_info *pfStack_888;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_880;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_878;
  fdb_kvs_handle **ppfStack_870;
  fdb_kvs_handle **ppfStack_868;
  code *pcStack_860;
  fdb_file_handle *pfStack_848;
  uint uStack_83c;
  fdb_kvs_handle *apfStack_838 [4];
  fdb_kvs_info fStack_818;
  fdb_kvs_config fStack_7e8;
  char acStack_7d0 [8];
  timeval tStack_7c8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_7b8 [5];
  btree *apbStack_790 [5];
  btree *apbStack_768 [5];
  btree *apbStack_740 [5];
  char acStack_718 [256];
  char acStack_618 [256];
  char acStack_518 [256];
  fdb_config fStack_418;
  fdb_kvs_handle *pfStack_320;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_318;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_310;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_308;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_300;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_2f8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  fdb_kvs_handle *pfStack_2d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_2d0;
  ulong uStack_2c8;
  fdb_kvs_handle *pfStack_2c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2b8;
  size_t sStack_2b0;
  fdb_kvs_handle *pfStack_2a8;
  timeval tStack_2a0;
  fdb_kvs_handle fStack_290;
  void *pvStack_58;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar15;
  
  pfVar9 = (fdb_kvs_handle *)&stack0xffffffffffffffd8;
  uVar5 = 0;
  gettimeofday((timeval *)&stack0xffffffffffffffd8,(__timezone_ptr_t)0x0);
  iVar4 = *(int *)((long)ctx + 0x10);
  *(int *)((long)ctx + 0x10) = iVar4 + -1;
  if (iVar4 < 1) {
    return 0;
  }
  if (kv_name == (char *)0x0) {
    _snapshot_check(*ctx,*(int *)((long)ctx + 8),*(int *)((long)ctx + 0xc));
    _snapshot_update_docs(fhandle,(cb_snapshot_args *)ctx);
    _snapshot_check(*ctx,*(int *)((long)ctx + 8),*(int *)((long)ctx + 0xc));
    return 0;
  }
  cb_snapshot();
  pvStack_58 = ctx;
  paVar11 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
  paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119ac3;
  gettimeofday(&tStack_2a0,(__timezone_ptr_t)0x0);
  uStack_2e4 = (uint)uVar5;
  uVar14 = (int)(((uint)(uVar5 >> 0x1f) & 1) + uStack_2e4) >> 1;
  paVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)uVar14;
  pfVar34 = &fStack_290;
  paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119ae5;
  pfStack_2c0 = pfVar9;
  fdb_get_kvs_info(pfVar9,(fdb_kvs_info *)pfVar34);
  uVar5 = (ulong)(int)uVar14;
  uStack_2c8 = uVar5;
  if (fStack_290.kvs_config.custom_cmp != (fdb_custom_cmp_variable)((long)(int)extraout_EDX * uVar5)
     ) {
    paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c61;
    _snapshot_check();
    uVar5 = extraout_RAX;
  }
  paStack_2d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)extraout_EDX;
  if ((int)extraout_EDX < 1) {
    paStack_2d0 = paVar11;
  }
  handle_00.seqtree = (btree *)0x0;
  while( true ) {
    paVar31 = paStack_2d0;
    if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)handle_00.seqtree == paStack_2d0) {
      return (fdb_compact_decision)uVar5;
    }
    aStack_2b8.seqtree = (btree *)&(handle_00.seqtree)->vsize;
    paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119b35;
    pfVar9 = pfStack_2c0;
    fVar2 = fdb_snapshot_open(pfStack_2c0,&pfStack_2d8,(long)aStack_2b8.seqtree * uStack_2c8);
    uVar21 = (uint)pfVar9;
    pfVar9 = pfVar34;
    __s = paVar15;
    paStack_308 = paVar11;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    if (0 < (int)uStack_2e4) {
      uStack_2e0 = handle_00._0_4_;
      uStack_2dc = (uStack_2e0 - ((int)(uStack_2e0 - 1) >> 0x1f)) - 1 | 1;
      uStack_2e0 = uStack_2e0 & 0x7ffffffe;
      paVar31 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
      do {
        iVar4 = (int)paVar31;
        if ((int)uVar14 <= iVar4 &&
            (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)handle_00.seqtree ==
            (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) break;
        uVar21 = uStack_2dc;
        if (iVar4 < (int)uVar14) {
          uVar21 = uStack_2e0;
        }
        __s = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
              &fStack_290.config.min_block_reuse_filesize;
        paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119baa;
        sprintf((char *)__s,"key%04d",paVar31);
        unaff_R13.seqtree = (btree *)&fStack_290.trie;
        paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119bc8;
        sprintf((char *)unaff_R13.seqtree,"body%04d_update%d",paVar31,(ulong)uVar21);
        pfVar9 = pfStack_2d8;
        paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119bd5;
        sVar6 = strlen((char *)__s);
        paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119bee;
        fVar2 = fdb_get_kv(pfVar9,__s,sVar6 + 1,&pfStack_2a8,&sStack_2b0);
        pfVar34 = pfStack_2a8;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c6b;
          _snapshot_check();
LAB_00119c6b:
          uVar21 = (int)&fStack_290 + 0x30;
          paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c7b;
          _snapshot_check();
          paStack_308 = paVar15;
          goto LAB_00119c7b;
        }
        paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c07;
        iVar3 = bcmp(pfStack_2a8,unaff_R13.seqtree,sStack_2b0);
        pfVar9 = pfVar34;
        if (iVar3 != 0) goto LAB_00119c6b;
        paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c13;
        fdb_free_block(pfVar34);
        paVar31 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)(iVar4 + 1U);
        paVar11 = paVar15;
      } while (uStack_2e4 != iVar4 + 1U);
    }
    paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c2e;
    fVar2 = fdb_kvs_close(pfStack_2d8);
    uVar5 = (ulong)(uint)fVar2;
    handle_00 = aStack_2b8;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c45;
      _snapshot_check();
      return extraout_EAX;
    }
  }
LAB_00119c7b:
  paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)rollback_to_zero_test;
  _snapshot_check();
  pcStack_860 = (code *)0x119ca2;
  pfStack_320 = pfVar9;
  aStack_318 = handle_00;
  aStack_310 = unaff_R13;
  paStack_300 = paVar31;
  paStack_2f8 = __s;
  gettimeofday((timeval *)(acStack_7d0 + 8),(__timezone_ptr_t)0x0);
  pcStack_860 = (code *)0x119ca7;
  memleak_start();
  pcStack_860 = (code *)0x119cb3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_860 = (code *)0x119cc3;
  fdb_get_default_config();
  pcStack_860 = (code *)0x119ccd;
  fdb_get_default_kvs_config();
  fStack_418.buffercache_size = 0;
  fStack_418.wal_threshold = 0x400;
  fStack_418.flags = 1;
  fStack_418.compaction_threshold = '\0';
  pcStack_860 = (code *)0x119d00;
  fStack_418.multi_kv_instances = (bool)(char)uVar21;
  fdb_open(&pfStack_848,"./mvcc_test1",&fStack_418);
  uStack_83c = uVar21;
  if (uVar21 == 0) {
    pcStack_860 = (code *)0x119d6f;
    fdb_kvs_open_default(pfStack_848,apfStack_838,&fStack_7e8);
    lVar16 = 1;
  }
  else {
    ppfVar13 = apfStack_838;
    handle_00.seqtree = (btree *)&fStack_7e8;
    uVar5 = 0;
    do {
      pcStack_860 = (code *)0x119d34;
      sprintf(acStack_7d0,"kv%d",uVar5 & 0xffffffff);
      pcStack_860 = (code *)0x119d47;
      fdb_kvs_open(pfStack_848,ppfVar13,acStack_7d0,(fdb_kvs_config *)handle_00.seqtree);
      uVar5 = uVar5 + 1;
      ppfVar13 = ppfVar13 + 1;
    } while (uVar5 != 4);
    lVar16 = 4;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  ppfVar13 = (fdb_kvs_handle **)0x0;
  pcVar10 = logCallbackFunc;
  pcVar32 = "rollback_to_zero_test";
  do {
    pfVar9 = apfStack_838[(long)ppfVar13];
    pcStack_860 = (code *)0x119d95;
    fVar2 = fdb_set_log_callback(pfVar9,logCallbackFunc,"rollback_to_zero_test");
    iVar4 = (int)pfVar9;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_860 = (code *)0x11a31e;
      rollback_to_zero_test();
      goto LAB_0011a31e;
    }
    ppfVar13 = (fdb_kvs_handle **)((long)ppfVar13 + 1);
  } while ((fdb_kvs_handle **)lVar16 != ppfVar13);
  uVar5 = 0;
  do {
    pcStack_860 = (code *)0x119dc4;
    sprintf(acStack_618,"key%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x119de0;
    sprintf(acStack_718,"meta%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x119dfc;
    sprintf(acStack_518,"body%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x119e0f;
    sVar6 = strlen(acStack_618);
    pcStack_860 = (code *)0x119e1a;
    sVar7 = strlen(acStack_718);
    pcStack_860 = (code *)0x119e25;
    sVar8 = strlen(acStack_518);
    pcStack_860 = (code *)0x119e4a;
    fdb_doc_create((fdb_doc **)&aaStack_7b8[uVar5].seqtree,acStack_618,sVar6,acStack_718,sVar7,
                   acStack_518,sVar8);
    lVar26 = 0;
    do {
      pcStack_860 = (code *)0x119e5a;
      fdb_set(apfStack_838[lVar26],(fdb_doc *)aaStack_7b8[uVar5].seqtree);
      lVar26 = lVar26 + 1;
    } while (lVar16 != lVar26);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 5);
  pcStack_860 = (code *)0x119e7e;
  fdb_commit(pfStack_848,'\x01');
  uVar5 = 5;
  do {
    pcStack_860 = (code *)0x119ea0;
    sprintf(acStack_618,"key%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x119ebc;
    sprintf(acStack_718,"meta%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x119ed8;
    sprintf(acStack_518,"body%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x119eeb;
    sVar6 = strlen(acStack_618);
    pcStack_860 = (code *)0x119ef6;
    sVar7 = strlen(acStack_718);
    pcStack_860 = (code *)0x119f01;
    sVar8 = strlen(acStack_518);
    pcStack_860 = (code *)0x119f26;
    fdb_doc_create((fdb_doc **)&aaStack_7b8[uVar5].seqtree,acStack_618,sVar6,acStack_718,sVar7,
                   acStack_518,sVar8);
    lVar26 = 0;
    do {
      pcStack_860 = (code *)0x119f37;
      fdb_set(apfStack_838[lVar26],(fdb_doc *)aaStack_7b8[uVar5].seqtree);
      lVar26 = lVar26 + 1;
    } while (lVar16 != lVar26);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 10);
  pcStack_860 = (code *)0x119f58;
  fdb_commit(pfStack_848,'\0');
  uVar5 = 10;
  do {
    pcStack_860 = (code *)0x119f7a;
    sprintf(acStack_618,"key%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x119f96;
    sprintf(acStack_718,"meta%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x119fb2;
    sprintf(acStack_518,"body%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x119fc5;
    sVar6 = strlen(acStack_618);
    pcStack_860 = (code *)0x119fd0;
    sVar7 = strlen(acStack_718);
    pcStack_860 = (code *)0x119fdb;
    sVar8 = strlen(acStack_518);
    pcStack_860 = (code *)0x11a000;
    fdb_doc_create((fdb_doc **)&aaStack_7b8[uVar5].seqtree,acStack_618,sVar6,acStack_718,sVar7,
                   acStack_518,sVar8);
    lVar26 = 0;
    do {
      pcStack_860 = (code *)0x11a011;
      fdb_set(apfStack_838[lVar26],(fdb_doc *)aaStack_7b8[uVar5].seqtree);
      lVar26 = lVar26 + 1;
    } while (lVar16 != lVar26);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0xf);
  pcStack_860 = (code *)0x11a035;
  fdb_commit(pfStack_848,'\x01');
  uVar5 = 0xf;
  do {
    pcStack_860 = (code *)0x11a057;
    sprintf(acStack_618,"key%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x11a073;
    sprintf(acStack_718,"meta%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x11a08f;
    sprintf(acStack_518,"body%d",uVar5 & 0xffffffff);
    handle_00.seqtree = (btree *)(aaStack_7b8 + uVar5);
    pcStack_860 = (code *)0x11a0a2;
    sVar6 = strlen(acStack_618);
    pcStack_860 = (code *)0x11a0ad;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_718);
    pcStack_860 = (code *)0x11a0b8;
    sVar7 = strlen(acStack_518);
    pcStack_860 = (code *)0x11a0dd;
    fdb_doc_create((fdb_doc **)handle_00.seqtree,acStack_618,sVar6,acStack_718,(size_t)unaff_R13,
                   acStack_518,sVar7);
    ppfVar13 = (fdb_kvs_handle **)0x0;
    do {
      pcStack_860 = (code *)0x11a0ee;
      fdb_set(apfStack_838[(long)ppfVar13],
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(handle_00.seqtree)->ksize)->
              seqtree);
      ppfVar13 = (fdb_kvs_handle **)((long)ppfVar13 + 1);
    } while ((fdb_kvs_handle **)lVar16 != ppfVar13);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x14);
  pcStack_860 = (code *)0x11a10f;
  fdb_commit(pfStack_848,'\0');
  pcVar10 = (code *)(ulong)uStack_83c;
  if ((char)uStack_83c != '\0') {
    handle_00.seqtree = (btree *)&fStack_818.doc_count;
    unaff_R13.seqtree = (btree *)&fStack_818.space_used;
    pcVar10 = (code *)(apfStack_838 + 4);
    pcVar32 = (char *)apfStack_838;
    do {
      ppfVar13 = (fdb_kvs_handle **)pcVar32;
      pcStack_860 = (code *)0x11a13c;
      ppfVar30 = ppfVar13;
      fVar2 = fdb_rollback(ppfVar13,0);
      iVar4 = (int)ppfVar30;
      pcVar32 = (char *)ppfVar13;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a323;
      pfVar9 = *ppfVar13;
      pcStack_860 = (code *)0x11a152;
      fVar2 = fdb_get_kvs_info(pfVar9,(fdb_kvs_info *)pcVar10);
      iVar4 = (int)pfVar9;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a31e;
      if (fStack_818.last_seqnum != 0) {
        pcStack_860 = (code *)0x11a1bb;
        rollback_to_zero_test();
      }
      if (fStack_818.doc_count != 0) {
        pcStack_860 = (code *)0x11a1c5;
        rollback_to_zero_test();
      }
      if (fStack_818.space_used != 0) {
        pcStack_860 = (code *)0x11a1cf;
        rollback_to_zero_test();
      }
      pfVar9 = *ppfVar13;
      pcStack_860 = (code *)0x11a182;
      fVar2 = fdb_get(pfVar9,(fdb_doc *)aaStack_7b8[0].seqtree);
      iVar4 = (int)pfVar9;
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a32d;
      pfVar9 = *ppfVar13;
      pcStack_860 = (code *)0x11a19b;
      fVar2 = fdb_set(pfVar9,(fdb_doc *)aaStack_7b8[0].seqtree);
      iVar4 = (int)pfVar9;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a328;
      pcVar32 = (char *)(ppfVar13 + 1);
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
LAB_0011a267:
    pcStack_860 = (code *)0x11a276;
    pfVar22 = pfStack_848;
    fVar2 = fdb_commit(pfStack_848,'\x01');
    iVar4 = (int)pfVar22;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_860 = (code *)0x11a288;
      fdb_close(pfStack_848);
      lVar16 = 0;
      do {
        pcStack_860 = (code *)0x11a297;
        fdb_doc_free((fdb_doc *)aaStack_7b8[lVar16].seqtree);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x14);
      pcStack_860 = (code *)0x11a2a5;
      fdb_shutdown();
      pcStack_860 = (code *)0x11a2aa;
      memleak_end();
      pcVar32 = "single kv mode:";
      if ((char)uStack_83c != '\0') {
        pcVar32 = "multiple kv mode:";
      }
      pcStack_860 = (code *)0x11a2da;
      sprintf(acStack_518,"rollback to zero test %s",pcVar32);
      pcVar32 = "%s PASSED\n";
      if (rollback_to_zero_test(bool)::__test_pass != '\0') {
        pcVar32 = "%s FAILED\n";
      }
      pcStack_860 = (code *)0x11a307;
      iVar4 = fprintf(_stderr,pcVar32,acStack_518);
      return iVar4;
    }
    goto LAB_0011a332;
  }
  ppfVar30 = apfStack_838;
  pcStack_860 = (code *)0x11a1dd;
  fVar2 = fdb_rollback(ppfVar30,0);
  iVar4 = (int)ppfVar30;
  pcVar32 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a337;
  pcStack_860 = (code *)0x11a1f4;
  pfVar9 = apfStack_838[0];
  fVar2 = fdb_get_kvs_info(apfStack_838[0],(fdb_kvs_info *)(apfStack_838 + 4));
  iVar4 = (int)pfVar9;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a33c;
  if (fStack_818.last_seqnum != 0) {
    pcStack_860 = (code *)0x11a20e;
    rollback_to_zero_test();
  }
  if (fStack_818.doc_count != 0) {
    pcStack_860 = (code *)0x11a220;
    rollback_to_zero_test();
  }
  if (fStack_818.space_used != 0) {
    pcStack_860 = (code *)0x11a232;
    rollback_to_zero_test();
  }
  pcStack_860 = (code *)0x11a244;
  pfVar9 = apfStack_838[0];
  fVar2 = fdb_get(apfStack_838[0],(fdb_doc *)aaStack_7b8[0].seqtree);
  iVar4 = (int)pfVar9;
  if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a341;
  pcStack_860 = (code *)0x11a25f;
  fVar2 = fdb_set(apfStack_838[0],(fdb_doc *)aaStack_7b8[0].seqtree);
  iVar4 = (int)apfStack_838[0];
  if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011a267;
  goto LAB_0011a346;
LAB_0011a977:
  pcStack_b88 = (code *)0x11a97c;
  rollback_to_zero_after_compact_test();
LAB_0011a97c:
  pcStack_b88 = (code *)0x11a981;
  rollback_to_zero_after_compact_test();
LAB_0011a981:
  pcStack_b88 = (code *)0x11a986;
  rollback_to_zero_after_compact_test();
LAB_0011a986:
  pcStack_b88 = (code *)0x11a98b;
  rollback_to_zero_after_compact_test();
  goto LAB_0011a98b;
LAB_0011b672:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b677;
  rollback_all_test();
LAB_0011b677:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b67c;
  rollback_all_test();
LAB_0011b67c:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b684;
  rollback_all_test();
  aVar20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar10;
LAB_0011b684:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b689;
  rollback_all_test();
LAB_0011b689:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b68e;
  rollback_all_test();
LAB_0011b68e:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b693;
  rollback_all_test();
LAB_0011b693:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b698;
  rollback_all_test();
  goto LAB_0011b698;
LAB_0011be65:
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be6a;
  rollback_during_ops_test();
LAB_0011be6a:
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be6f;
  rollback_during_ops_test();
  goto LAB_0011be6f;
LAB_0011c266:
  aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c26b;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c26b;
LAB_0011c67b:
  pcStack_4a30 = (code *)0x11c680;
  rollback_drop_multi_files_kvs_test();
LAB_0011c680:
  pcStack_4a30 = (code *)0x11c685;
  rollback_drop_multi_files_kvs_test();
LAB_0011c685:
  pcStack_4a30 = (code *)0x11c68a;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68a:
  pcStack_4a30 = (code *)0x11c68f;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68f:
  pcStack_4a30 = (code *)0x11c694;
  rollback_drop_multi_files_kvs_test();
LAB_0011c694:
  pcStack_4a30 = (code *)0x11c699;
  rollback_drop_multi_files_kvs_test();
LAB_0011c699:
  pcStack_4a30 = (code *)0x11c69e;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c69e;
LAB_0011cbcd:
  pcStack_4f38 = (code *)0x11cbd2;
  rollback_without_seqtree();
  goto LAB_0011cbd2;
LAB_0011cf63:
  pfStack_5110 = (fdb_kvs_handle *)0x11cf68;
  tx_crash_recover_test();
LAB_0011cf68:
  pfStack_5110 = (fdb_kvs_handle *)0x11cf6d;
  tx_crash_recover_test();
  goto LAB_0011cf6d;
LAB_0011a31e:
  pcStack_860 = (code *)0x11a323;
  rollback_to_zero_test();
LAB_0011a323:
  pcStack_860 = (code *)0x11a328;
  rollback_to_zero_test();
LAB_0011a328:
  pcStack_860 = (code *)0x11a32d;
  rollback_to_zero_test();
LAB_0011a32d:
  pcStack_860 = (code *)0x11a332;
  rollback_to_zero_test();
LAB_0011a332:
  pcStack_860 = (code *)0x11a337;
  rollback_to_zero_test();
LAB_0011a337:
  pcStack_860 = (code *)0x11a33c;
  rollback_to_zero_test();
LAB_0011a33c:
  pcStack_860 = (code *)0x11a341;
  rollback_to_zero_test();
LAB_0011a341:
  pcStack_860 = (code *)0x11a346;
  rollback_to_zero_test();
LAB_0011a346:
  pcStack_860 = rollback_to_zero_after_compact_test;
  rollback_to_zero_test();
  pcStack_b88 = (code *)0x11a36d;
  pfStack_888 = (fdb_kvs_info *)pcVar10;
  aStack_880 = handle_00;
  aStack_878 = unaff_R13;
  ppfStack_870 = ppfVar13;
  ppfStack_868 = (fdb_kvs_handle **)pcVar32;
  pcStack_860 = (code *)lVar16;
  gettimeofday(&tStack_a30,(__timezone_ptr_t)0x0);
  pcStack_b88 = (code *)0x11a379;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_b88 = (code *)0x11a389;
  fdb_get_default_config();
  pcStack_b88 = (code *)0x11a396;
  fdb_get_default_kvs_config();
  fStack_980.buffercache_size = 0;
  fStack_980.wal_threshold = 0x400;
  fStack_980.flags = 1;
  fStack_980.compaction_threshold = '\0';
  pcStack_b88 = (code *)0x11a3c9;
  fStack_980.multi_kv_instances = (bool)(char)iVar4;
  fdb_open((fdb_file_handle **)&pfStack_b78,"./mvcc_test1",&fStack_980);
  iStack_b6c = iVar4;
  if (iVar4 == 0) {
    pcStack_b88 = (code *)0x11a43e;
    fdb_kvs_open_default
              ((fdb_file_handle *)pfStack_b78,(fdb_kvs_handle **)auStack_b60,
               (fdb_kvs_config *)(auStack_b60 + 0xd0));
    pcVar32 = (char *)0x1;
  }
  else {
    ppfVar13 = (fdb_kvs_handle **)auStack_b60;
    handle_00.seqtree = (btree *)(auStack_b60 + 0xd0);
    uVar5 = 0;
    do {
      pcStack_b88 = (code *)0x11a400;
      sprintf(acStack_a78,"kv%d",uVar5 & 0xffffffff);
      pcStack_b88 = (code *)0x11a413;
      fdb_kvs_open((fdb_file_handle *)pfStack_b78,ppfVar13,acStack_a78,
                   (fdb_kvs_config *)handle_00.seqtree);
      uVar5 = uVar5 + 1;
      ppfVar13 = ppfVar13 + 1;
    } while (uVar5 != 4);
    pcVar32 = (char *)0x4;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar28 = (char *)0x0;
  pcVar10 = logCallbackFunc;
  pcVar27 = "rollback_to_zero_after_compact_test";
  do {
    pfVar9 = *(fdb_kvs_handle **)(auStack_b60 + (long)pcVar28 * 8);
    pcStack_b88 = (code *)0x11a464;
    fVar2 = fdb_set_log_callback(pfVar9,logCallbackFunc,"rollback_to_zero_after_compact_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_b88 = (code *)0x11a977;
      rollback_to_zero_after_compact_test();
      goto LAB_0011a977;
    }
    pcVar28 = pcVar28 + 1;
  } while (pcVar32 != pcVar28);
  uVar5 = 0;
  do {
    pcStack_b88 = (code *)0x11a493;
    sprintf(auStack_b60 + 0x90,"key%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a4a9;
    sprintf(auStack_b60 + 0x50,"meta%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a4c2;
    sprintf(acStack_a70,"body%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a4d5;
    sVar6 = strlen(auStack_b60 + 0x90);
    pcStack_b88 = (code *)0x11a4e5;
    sVar7 = strlen(auStack_b60 + 0x50);
    pcStack_b88 = (code *)0x11a4f5;
    sVar8 = strlen(acStack_a70);
    pcStack_b88 = (code *)0x11a51a;
    fdb_doc_create((fdb_doc **)&aaStack_a20[uVar5].seqtree,auStack_b60 + 0x90,sVar6,
                   auStack_b60 + 0x50,sVar7,acStack_a70,sVar8);
    lVar16 = 0;
    do {
      pcStack_b88 = (code *)0x11a52b;
      fdb_set(*(fdb_kvs_handle **)(auStack_b60 + lVar16 * 8),(fdb_doc *)aaStack_a20[uVar5].seqtree);
      lVar16 = lVar16 + 1;
    } while (pcVar32 != (char *)lVar16);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 5);
  pcStack_b88 = (code *)0x11a54f;
  fdb_commit((fdb_file_handle *)pfStack_b78,'\x01');
  uVar5 = 5;
  do {
    pcStack_b88 = (code *)0x11a571;
    sprintf(auStack_b60 + 0x90,"key%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a58a;
    sprintf(auStack_b60 + 0x50,"meta%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a5a6;
    sprintf(acStack_a70,"body%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a5b9;
    sVar6 = strlen(auStack_b60 + 0x90);
    pcStack_b88 = (code *)0x11a5c4;
    sVar7 = strlen(auStack_b60 + 0x50);
    pcStack_b88 = (code *)0x11a5cf;
    sVar8 = strlen(acStack_a70);
    pcStack_b88 = (code *)0x11a5f1;
    fdb_doc_create((fdb_doc **)&aaStack_a20[uVar5].seqtree,auStack_b60 + 0x90,sVar6,
                   auStack_b60 + 0x50,sVar7,acStack_a70,sVar8);
    lVar16 = 0;
    do {
      pcStack_b88 = (code *)0x11a601;
      fdb_set(*(fdb_kvs_handle **)(auStack_b60 + lVar16 * 8),(fdb_doc *)aaStack_a20[uVar5].seqtree);
      lVar16 = lVar16 + 1;
    } while (pcVar32 != (char *)lVar16);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 10);
  pcStack_b88 = (code *)0x11a622;
  fdb_commit((fdb_file_handle *)pfStack_b78,'\0');
  uVar5 = 10;
  do {
    pcStack_b88 = (code *)0x11a644;
    sprintf(auStack_b60 + 0x90,"key%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a65d;
    sprintf(auStack_b60 + 0x50,"meta%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a679;
    sprintf(acStack_a70,"body%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a68c;
    sVar6 = strlen(auStack_b60 + 0x90);
    pcStack_b88 = (code *)0x11a697;
    sVar7 = strlen(auStack_b60 + 0x50);
    pcStack_b88 = (code *)0x11a6a2;
    sVar8 = strlen(acStack_a70);
    pcStack_b88 = (code *)0x11a6c4;
    fdb_doc_create((fdb_doc **)&aaStack_a20[uVar5].seqtree,auStack_b60 + 0x90,sVar6,
                   auStack_b60 + 0x50,sVar7,acStack_a70,sVar8);
    lVar16 = 0;
    do {
      pcStack_b88 = (code *)0x11a6d4;
      fdb_set(*(fdb_kvs_handle **)(auStack_b60 + lVar16 * 8),(fdb_doc *)aaStack_a20[uVar5].seqtree);
      lVar16 = lVar16 + 1;
    } while (pcVar32 != (char *)lVar16);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0xf);
  pcStack_b88 = (code *)0x11a6f8;
  fdb_commit((fdb_file_handle *)pfStack_b78,'\x01');
  uVar5 = 0xf;
  do {
    pcStack_b88 = (code *)0x11a71a;
    sprintf(auStack_b60 + 0x90,"key%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a733;
    sprintf(auStack_b60 + 0x50,"meta%d",uVar5 & 0xffffffff);
    pcVar28 = acStack_a70;
    pcStack_b88 = (code *)0x11a74f;
    sprintf(pcVar28,"body%d",uVar5 & 0xffffffff);
    unaff_R13.seqtree = (btree *)(aaStack_a20 + uVar5);
    pcStack_b88 = (code *)0x11a762;
    sVar6 = strlen(auStack_b60 + 0x90);
    pcStack_b88 = (code *)0x11a76d;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(auStack_b60 + 0x50);
    pcStack_b88 = (code *)0x11a778;
    sVar7 = strlen(pcVar28);
    pcStack_b88 = (code *)0x11a79a;
    fdb_doc_create((fdb_doc **)unaff_R13.seqtree,auStack_b60 + 0x90,sVar6,auStack_b60 + 0x50,
                   (size_t)handle_00,pcVar28,sVar7);
    pcVar10 = (code *)0x0;
    do {
      pcStack_b88 = (code *)0x11a7aa;
      fdb_set(*(fdb_kvs_handle **)(auStack_b60 + (long)pcVar10 * 8),
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(unaff_R13.seqtree)->ksize)->
              seqtree);
      pcVar10 = (code *)((long)pcVar10 + 1);
    } while ((code *)pcVar32 != pcVar10);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x14);
  pcStack_b88 = (code *)0x11a7cb;
  fdb_commit((fdb_file_handle *)pfStack_b78,'\0');
  pfVar9 = (fdb_kvs_handle *)&pfStack_b68;
  pcStack_b88 = (code *)0x11a7e4;
  fVar2 = fdb_open((fdb_file_handle **)pfVar9,"./mvcc_test1",&fStack_980);
  pcVar27 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_b88 = (code *)0x11a7fd;
    pfVar9 = pfStack_b68;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_b68,"./mvcc_test2");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a990;
    pcStack_b88 = (code *)0x11a80f;
    fdb_close((fdb_file_handle *)pfStack_b68);
    pcVar28 = auStack_b60 + 0x30;
    handle_00.seqtree = (btree *)(auStack_b60 + 0x40);
    pcVar32 = (char *)(ulong)(uint)((int)pcVar32 << 3);
    pcVar27 = (char *)0x0;
    unaff_R13.seqtree = (btree *)(auStack_b60 + 0x20);
    do {
      pcVar10 = (code *)(auStack_b60 + (long)pcVar27);
      pcStack_b88 = (code *)0x11a836;
      pfVar9 = (fdb_kvs_handle *)pcVar10;
      fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar10,0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a97c;
      pfVar9 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar10)->kvs_config;
      pcStack_b88 = (code *)0x11a849;
      fVar2 = fdb_get_kvs_info(pfVar9,(fdb_kvs_info *)unaff_R13.seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a977;
      if ((hbtrie *)auStack_b60._40_8_ != (hbtrie *)0x0) {
        pcStack_b88 = (code *)0x11a8af;
        rollback_to_zero_after_compact_test();
      }
      if ((btree *)auStack_b60._48_8_ != (btree *)0x0) {
        pcStack_b88 = (code *)0x11a8b9;
        rollback_to_zero_after_compact_test();
      }
      if ((filemgr *)auStack_b60._64_8_ != (filemgr *)0x0) {
        pcStack_b88 = (code *)0x11a8c3;
        rollback_to_zero_after_compact_test();
      }
      pfVar9 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar10)->kvs_config;
      pcStack_b88 = (code *)0x11a879;
      fVar2 = fdb_get(pfVar9,(fdb_doc *)aaStack_a20[0].seqtree);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a986;
      pfVar9 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar10)->kvs_config;
      pcStack_b88 = (code *)0x11a892;
      fVar2 = fdb_set(pfVar9,(fdb_doc *)aaStack_a20[0].seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a981;
      pcVar27 = pcVar27 + 8;
    } while (pcVar32 != pcVar27);
    pcStack_b88 = (code *)0x11a8d4;
    pfVar9 = pfStack_b78;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_b78,'\x01');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_b88 = (code *)0x11a8e6;
      fdb_close((fdb_file_handle *)pfStack_b78);
      lVar16 = 0;
      do {
        pcStack_b88 = (code *)0x11a8f5;
        fdb_doc_free((fdb_doc *)aaStack_a20[lVar16].seqtree);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x14);
      pcStack_b88 = (code *)0x11a903;
      fdb_shutdown();
      pcVar32 = "single kv mode:";
      if ((char)iStack_b6c != '\0') {
        pcVar32 = "multiple kv mode:";
      }
      pcStack_b88 = (code *)0x11a933;
      sprintf(acStack_a70,"rollback to zero after compact test %s",pcVar32);
      pcVar32 = "%s PASSED\n";
      if (rollback_to_zero_after_compact_test(bool)::__test_pass != '\0') {
        pcVar32 = "%s FAILED\n";
      }
      pcStack_b88 = (code *)0x11a960;
      iVar4 = fprintf(_stderr,pcVar32,acStack_a70);
      return iVar4;
    }
  }
  else {
LAB_0011a98b:
    pcStack_b88 = (code *)0x11a990;
    rollback_to_zero_after_compact_test();
LAB_0011a990:
    pcStack_b88 = (code *)0x11a995;
    rollback_to_zero_after_compact_test();
  }
  pcStack_b88 = rollback_to_wal_test;
  rollback_to_zero_after_compact_test();
  __s_00 = (char *)((ulong)pfVar9 & 0xffffffff);
  pcStack_1990 = (code *)0x11a9b9;
  pfStack_bb0 = (fdb_kvs_handle *)pcVar10;
  aStack_ba8 = handle_00;
  aStack_ba0 = unaff_R13;
  pcStack_b98 = pcVar27;
  pcStack_b90 = pcVar28;
  pcStack_b88 = (code *)pcVar32;
  gettimeofday(&tStack_1940,(__timezone_ptr_t)0x0);
  pcStack_1990 = (code *)0x11a9be;
  memleak_start();
  pcStack_1990 = (code *)0x11a9ca;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_1990 = (code *)0x11a9da;
  fdb_get_default_config();
  config = &fStack_1930;
  pcStack_1990 = (code *)0x11a9e7;
  fdb_get_default_kvs_config();
  fStack_1610.buffercache_size = 0;
  fStack_1610.wal_threshold = 0x100;
  fStack_1610.flags = 1;
  fStack_1610.compaction_threshold = '\0';
  uStack_1954 = SUB84(pfVar9,0);
  fStack_1610.multi_kv_instances = SUB81(__s_00,0);
  doc_01 = (fdb_doc *)(auStack_1978 + 0x18);
  pcStack_1990 = (code *)0x11aa21;
  fdb_open((fdb_file_handle **)doc_01,"./mvcc_test8",&fStack_1610);
  ptr_handle = (fdb_doc *)auStack_1978;
  pcStack_1990 = (code *)0x11aa34;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1978._24_8_,(fdb_kvs_handle **)ptr_handle,config);
  pcStack_1990 = (code *)0x11aa4a;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1978._0_8_,logCallbackFunc,"rollback_to_wal_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar16 = 0;
    uVar5 = 0;
    do {
      pcStack_1990 = (code *)0x11aa74;
      sprintf(acStack_1818,"key%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11aa8d;
      sprintf(acStack_1718,"meta%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11aaa3;
      sprintf((char *)afStack_1918,"body%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11aab6;
      sVar6 = strlen(acStack_1818);
      pcStack_1990 = (code *)0x11aac9;
      sVar7 = strlen(acStack_1718);
      pcStack_1990 = (code *)0x11aad6;
      sVar8 = strlen((char *)afStack_1918);
      pcStack_1990 = (code *)0x11aaf8;
      fdb_doc_create((fdb_doc **)((long)&pfStack_1518 + lVar16),acStack_1818,sVar6,acStack_1718,
                     sVar7,afStack_1918,sVar8);
      pcStack_1990 = (code *)0x11ab0a;
      fdb_set((fdb_kvs_handle *)auStack_1978._0_8_,(&pfStack_1518)[uVar5]);
      uVar5 = uVar5 + 1;
      lVar16 = lVar16 + 8;
    } while (uVar5 != 300);
    pcStack_1990 = (code *)0x11ab2a;
    fdb_commit((fdb_file_handle *)auStack_1978._24_8_,'\0');
    lVar16 = 0;
    uVar5 = 0;
    do {
      ppfStack_1948 = (fdb_doc **)((long)&pfStack_1518 + lVar16);
      pcStack_1990 = (code *)0x11ab4c;
      fdb_doc_free((&pfStack_1518)[uVar5]);
      pcStack_1990 = (code *)0x11ab68;
      sprintf(acStack_1818,"key%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11ab84;
      sprintf(acStack_1718,"META%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11ab9d;
      sprintf((char *)afStack_1918,"BODY%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11aba5;
      sVar6 = strlen(acStack_1818);
      pcStack_1990 = (code *)0x11abb0;
      sVar7 = strlen(acStack_1718);
      pcStack_1990 = (code *)0x11abbb;
      sVar8 = strlen((char *)afStack_1918);
      pcStack_1990 = (code *)0x11abdd;
      fdb_doc_create(ppfStack_1948,acStack_1818,sVar6,acStack_1718,sVar7,afStack_1918,sVar8);
      pcStack_1990 = (code *)0x11abef;
      fdb_set((fdb_kvs_handle *)auStack_1978._0_8_,(&pfStack_1518)[uVar5]);
      uVar5 = uVar5 + 1;
      lVar16 = lVar16 + 8;
    } while (uVar5 != 0x96);
    pcStack_1990 = (code *)0x11ac0f;
    fdb_commit((fdb_file_handle *)auStack_1978._24_8_,'\0');
    uVar5 = 0x96;
    doc_01 = afStack_1068;
    do {
      pcStack_1990 = (code *)0x11ac25;
      fdb_doc_free((fdb_doc *)doc_01->keylen);
      pcStack_1990 = (code *)0x11ac41;
      sprintf(acStack_1818,"key%d",uVar5 & 0xffffffff);
      __s_00 = acStack_1718;
      pcStack_1990 = (code *)0x11ac5d;
      sprintf(__s_00,"Meta%d",uVar5 & 0xffffffff);
      ptr_handle = afStack_1918;
      pcStack_1990 = (code *)0x11ac76;
      sprintf((char *)ptr_handle,"Body%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11ac7e;
      handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_1818);
      pcStack_1990 = (code *)0x11ac89;
      unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(__s_00);
      pcStack_1990 = (code *)0x11ac94;
      sVar6 = strlen((char *)ptr_handle);
      pcStack_1990 = (code *)0x11acb4;
      fdb_doc_create((fdb_doc **)doc_01,acStack_1818,(size_t)handle_00,__s_00,(size_t)unaff_R13,
                     ptr_handle,sVar6);
      pcStack_1990 = (code *)0x11acc1;
      fdb_set((fdb_kvs_handle *)auStack_1978._0_8_,(fdb_doc *)doc_01->keylen);
      uVar5 = uVar5 + 1;
      doc_01 = (fdb_doc *)&doc_01->metalen;
    } while (uVar5 != 300);
    pcStack_1990 = (code *)0x11ace1;
    fdb_commit((fdb_file_handle *)auStack_1978._24_8_,'\0');
    pcStack_1990 = (code *)0x11acf0;
    fVar2 = fdb_rollback((fdb_kvs_handle **)auStack_1978,0x1c2);
    config = (fdb_kvs_config *)0x12c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae48;
    pcStack_1990 = (code *)0x11ad21;
    fdb_doc_create((fdb_doc **)(auStack_1978 + 0x10),(void *)psStack_1510[4],*psStack_1510,
                   (void *)0x0,0,(void *)0x0,0);
    pcStack_1990 = (code *)0x11ad35;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1978._0_8_,&pfStack_1950,0x1c2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae4d;
    pcStack_1990 = (code *)0x11ad4c;
    fVar2 = fdb_get(pfStack_1950,(fdb_doc *)auStack_1978._16_8_);
    pfVar33 = (fdb_doc *)auStack_1978._16_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae52;
    ptr_handle = *(fdb_doc **)(auStack_1978._16_8_ + 0x40);
    config = (fdb_kvs_config *)psStack_1510[8];
    pcStack_1990 = (code *)0x11ad78;
    iVar4 = bcmp(ptr_handle,config,*(size_t *)(auStack_1978._16_8_ + 0x10));
    if (iVar4 == 0) {
      if (*(uint64_t *)((long)pfVar33 + 0x28) != 0x12e) {
        pcStack_1990 = (code *)0x11ad94;
        rollback_to_wal_test();
      }
      pcStack_1990 = (code *)0x11ad9e;
      fdb_doc_free((fdb_doc *)auStack_1978._16_8_);
      pcStack_1990 = (code *)0x11ada8;
      fdb_kvs_close(pfStack_1950);
      pcStack_1990 = (code *)0x11adb2;
      fdb_close((fdb_file_handle *)auStack_1978._24_8_);
      lVar16 = 0;
      do {
        pcStack_1990 = (code *)0x11adc1;
        fdb_doc_free((&pfStack_1518)[lVar16]);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 300);
      pcStack_1990 = (code *)0x11add2;
      fdb_shutdown();
      pcStack_1990 = (code *)0x11add7;
      memleak_end();
      pcVar32 = "single kv mode:";
      if ((char)uStack_1954 != '\0') {
        pcVar32 = "multiple kv mode:";
      }
      pcStack_1990 = (code *)0x11ae04;
      sprintf((char *)afStack_1918,"rollback to wal test %s",pcVar32);
      pcVar32 = "%s PASSED\n";
      if (rollback_to_wal_test(bool)::__test_pass != '\0') {
        pcVar32 = "%s FAILED\n";
      }
      pcStack_1990 = (code *)0x11ae31;
      iVar4 = fprintf(_stderr,pcVar32,afStack_1918);
      return iVar4;
    }
  }
  else {
    pcStack_1990 = (code *)0x11ae48;
    rollback_to_wal_test();
LAB_0011ae48:
    pcStack_1990 = (code *)0x11ae4d;
    rollback_to_wal_test();
LAB_0011ae4d:
    pcStack_1990 = (code *)0x11ae52;
    rollback_to_wal_test();
LAB_0011ae52:
    pfVar33 = doc_01;
    pcStack_1990 = (code *)0x11ae57;
    rollback_to_wal_test();
  }
  pcStack_1990 = rollback_all_test;
  pfVar23 = config;
  rollback_to_wal_test();
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ae87;
  pfStack_19b8 = ptr_handle;
  aStack_19b0 = handle_00;
  aStack_19a8 = unaff_R13;
  pfStack_19a0 = config;
  pfStack_1998 = pfVar33;
  pcStack_1990 = (code *)__s_00;
  gettimeofday(&tStack_1e60,(__timezone_ptr_t)0x0);
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ae8c;
  memleak_start();
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ae98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aea8;
  fdb_get_default_config();
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aeb2;
  fdb_get_default_kvs_config();
  fStack_1ab0.buffercache_size._0_1_ = '\0';
  fStack_1ab0.buffercache_size._1_1_ = '\0';
  fStack_1ab0.buffercache_size._2_1_ = '\0';
  fStack_1ab0.buffercache_size._3_1_ = '\0';
  fStack_1ab0.buffercache_size._4_1_ = '\0';
  fStack_1ab0.buffercache_size._5_1_ = '\0';
  fStack_1ab0.buffercache_size._6_1_ = '\0';
  fStack_1ab0.buffercache_size._7_1_ = '\0';
  fStack_1ab0.wal_threshold._0_1_ = '\0';
  fStack_1ab0.wal_threshold._1_1_ = '\x04';
  fStack_1ab0.wal_threshold._2_1_ = '\0';
  fStack_1ab0.wal_threshold._3_1_ = '\0';
  fStack_1ab0.wal_threshold._4_1_ = '\0';
  fStack_1ab0.wal_threshold._5_1_ = '\0';
  fStack_1ab0.wal_threshold._6_1_ = '\0';
  fStack_1ab0.wal_threshold._7_1_ = '\0';
  fStack_1ab0.flags = 1;
  fStack_1ab0.compaction_threshold = 0;
  fStack_1ab0.block_reusing_threshold = 0;
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aee8;
  fStack_1ab0.multi_kv_instances = (bool)(char)pfVar23;
  fdb_open(&pfStack_1f08,"./mvcc_test6",(fdb_config *)(acStack_1bb0 + 0x100));
  uStack_1efc = (uint)pfVar23;
  if (uStack_1efc == 0) {
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af54;
    fdb_kvs_open_default
              (pfStack_1f08,(fdb_kvs_handle **)&aaStack_1ee0[0].seqtree,
               (fdb_kvs_config *)(acStack_1eb0 + 8));
    aVar17 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
  }
  else {
    paVar11 = aaStack_1ee0;
    handle_00.seqtree = (btree *)(acStack_1eb0 + 8);
    uVar5 = 0;
    do {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af19;
      sprintf(acStack_1eb0,"kv%d",uVar5 & 0xffffffff);
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af2c;
      fdb_kvs_open(pfStack_1f08,(fdb_kvs_handle **)&paVar11->seqtree,acStack_1eb0,
                   (fdb_kvs_config *)handle_00.seqtree);
      uVar5 = uVar5 + 1;
      paVar11 = paVar11 + 1;
    } while (uVar5 != 4);
    aVar17 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar28 = (char *)0x0;
  pcVar10 = logCallbackFunc;
  pcVar32 = "rollback_all_test";
  do {
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af7a;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)aaStack_1ee0[(long)pcVar28].seqtree,logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b672;
      rollback_all_test();
      goto LAB_0011b672;
    }
    pcVar28 = (char *)((hbtrie_func_readkey *)pcVar28 + 1);
  } while (aVar17.seqtree != (btree *)pcVar28);
  uVar5 = 0;
  do {
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afa9;
    sprintf(acStack_1cb0,"key%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afc5;
    sprintf(acStack_1db0,"meta%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afe1;
    sprintf(acStack_1bb0,"body%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aff4;
    sVar6 = strlen(acStack_1cb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afff;
    sVar7 = strlen(acStack_1db0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b00a;
    sVar8 = strlen(acStack_1bb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b02f;
    fdb_doc_create((fdb_doc **)&aaStack_1e50[uVar5].seqtree,acStack_1cb0,sVar6,acStack_1db0,sVar7,
                   acStack_1bb0,sVar8);
    lVar16 = 0;
    do {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b03f;
      fdb_set((fdb_kvs_handle *)aaStack_1ee0[lVar16].seqtree,(fdb_doc *)aaStack_1e50[uVar5].seqtree)
      ;
      lVar16 = lVar16 + 1;
    } while (aVar17.seqtree != (btree *)lVar16);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 5);
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b063;
  fdb_commit(pfStack_1f08,'\x01');
  uVar5 = 5;
  do {
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b085;
    sprintf(acStack_1cb0,"key%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0a1;
    sprintf(acStack_1db0,"meta%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0bd;
    sprintf(acStack_1bb0,"body%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0d0;
    sVar6 = strlen(acStack_1cb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0db;
    sVar7 = strlen(acStack_1db0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0e6;
    sVar8 = strlen(acStack_1bb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b10b;
    fdb_doc_create((fdb_doc **)&aaStack_1e50[uVar5].seqtree,acStack_1cb0,sVar6,acStack_1db0,sVar7,
                   acStack_1bb0,sVar8);
    lVar16 = 0;
    do {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b11c;
      fdb_set((fdb_kvs_handle *)aaStack_1ee0[lVar16].seqtree,(fdb_doc *)aaStack_1e50[uVar5].seqtree)
      ;
      lVar16 = lVar16 + 1;
    } while (aVar17.seqtree != (btree *)lVar16);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 10);
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b13d;
  fdb_commit(pfStack_1f08,'\0');
  uVar5 = 10;
  do {
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b15f;
    sprintf(acStack_1cb0,"key%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b17b;
    sprintf(acStack_1db0,"meta%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b197;
    sprintf(acStack_1bb0,"body%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1aa;
    sVar6 = strlen(acStack_1cb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1b5;
    sVar7 = strlen(acStack_1db0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1c0;
    sVar8 = strlen(acStack_1bb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1e5;
    fdb_doc_create((fdb_doc **)&aaStack_1e50[uVar5].seqtree,acStack_1cb0,sVar6,acStack_1db0,sVar7,
                   acStack_1bb0,sVar8);
    lVar16 = 0;
    do {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1f6;
      fdb_set((fdb_kvs_handle *)aaStack_1ee0[lVar16].seqtree,(fdb_doc *)aaStack_1e50[uVar5].seqtree)
      ;
      lVar16 = lVar16 + 1;
    } while (aVar17.seqtree != (btree *)lVar16);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0xf);
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b21a;
  fdb_commit(pfStack_1f08,'\x01');
  uVar5 = 0xf;
  do {
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b23c;
    sprintf(acStack_1cb0,"key%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b258;
    sprintf(acStack_1db0,"meta%d",uVar5 & 0xffffffff);
    aVar20.seqtree = (btree *)acStack_1bb0;
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b274;
    sprintf((char *)aVar20.seqtree,"body%d",uVar5 & 0xffffffff);
    handle_00.seqtree = (btree *)(aaStack_1e50 + uVar5);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b287;
    sVar6 = strlen(acStack_1cb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b292;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_1db0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b29d;
    sVar7 = strlen((char *)aVar20.seqtree);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2c2;
    fdb_doc_create((fdb_doc **)handle_00.seqtree,acStack_1cb0,sVar6,acStack_1db0,(size_t)unaff_R13,
                   aVar20.seqtree,sVar7);
    pcVar28 = (char *)0x0;
    do {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2d3;
      fdb_set((fdb_kvs_handle *)aaStack_1ee0[(long)pcVar28].seqtree,
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(handle_00.seqtree)->ksize)->
              seqtree);
      pcVar28 = (char *)((long)pcVar28 + 1);
    } while (aVar17.seqtree != (btree *)pcVar28);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x14);
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2f4;
  fdb_commit(pfStack_1f08,'\0');
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b308;
  fVar2 = fdb_get_all_snap_markers
                    (pfStack_1f08,(fdb_snapshot_info_t **)&pfStack_1ef0,(uint64_t *)&pfStack_1ef8);
  pcVar32 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar28 = (char *)(ulong)uStack_1efc;
    cVar25 = (char)uStack_1efc;
    if (cVar25 == '\0') {
      if (pfStack_1ef8 != (fdb_kvs_handle *)0x4) {
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b341;
        rollback_all_test();
      }
    }
    else if (pfStack_1ef8 != (fdb_kvs_handle *)0x8) {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b32f;
      rollback_all_test();
    }
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b354;
    fVar2 = fdb_rollback_all(pfStack_1f08,(fdb_snapshot_marker_t)pfStack_1ef0->kvs);
    if (cVar25 == '\0') {
LAB_0011b41a:
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b69d;
      unaff_R13.seqtree = (btree *)&aStack_1ee8;
      if (cVar25 != '\0') {
        pcVar32 = acStack_1eb0;
        pcVar28 = "rollback_all_test";
        aVar20.seqtree = (btree *)0x0;
        handle_00 = aVar17;
        do {
          unaff_R13.seqtree = unaff_R13.seqtree + 8;
          aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b450;
          sprintf(pcVar32,"kv%d",aVar20.seqtree);
          aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b465;
          fVar2 = fdb_kvs_open(pfStack_1f08,(fdb_kvs_handle **)unaff_R13.seqtree,pcVar32,
                               (fdb_kvs_config *)(acStack_1eb0 + 8));
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b693;
          aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b480;
          fVar2 = fdb_set_log_callback
                            (*(fdb_kvs_handle **)unaff_R13.seqtree,logCallbackFunc,
                             "rollback_all_test");
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b68e;
          aVar20._0_4_ = aVar20._0_4_ + 1;
          aVar20._4_4_ = 0;
          handle_00.seqtree = (btree *)((long)(handle_00.seqtree + -1) + 0x37);
        } while (handle_00.seqtree != (btree *)0x0);
      }
      handle_00.seqtree = (btree *)0x0;
      unaff_R13.seqtree = (btree *)&aStack_1ee8;
      pcVar32 = (char *)&aStack_1eb8;
      do {
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4b2;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aaStack_1ee0[(long)handle_00].seqtree,
                                 &fStack_1e90);
        pcVar10 = (code *)aVar20;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b677;
        if (fStack_1e90.last_seqnum != 0xf) {
          aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b566;
          rollback_all_test();
        }
        if (fStack_1e90.doc_count != 0xf) {
          aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b578;
          rollback_all_test();
        }
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4ea;
        fVar2 = fdb_get((fdb_kvs_handle *)aaStack_1ee0[(long)handle_00].seqtree,pfStack_1db8);
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b672;
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b512;
        fVar2 = fdb_get_kv((fdb_kvs_handle *)aaStack_1ee0[(long)handle_00].seqtree,
                           (aaStack_1e50[0].seqtrie)->aux,
                           *(size_t *)&(aaStack_1e50[0].seqtree)->ksize,(void **)unaff_R13.seqtree,
                           (size_t *)pcVar32);
        pcVar10 = (code *)aStack_1ee8;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b684;
        pcVar28 = (char *)(aaStack_1e50[0].seqtrie)->readkey;
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b53b;
        iVar4 = bcmp(pcVar28,aStack_1ee8.seqtree,(size_t)aStack_1eb8);
        if (iVar4 != 0) goto LAB_0011b67c;
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b54b;
        free(pcVar10);
        uVar14 = uStack_1efc;
        handle_00.seqtree = (btree *)&(handle_00.seqtree)->vsize;
        aVar20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar10;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar17.seqtree != handle_00.seqtree);
      aVar20.seqtree = (btree *)0x0;
      pcVar28 = (char *)(ulong)uStack_1efc;
      do {
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b596;
        fVar2 = fdb_set((fdb_kvs_handle *)aaStack_1ee0[(long)aVar20].seqtree,
                        (fdb_doc *)aaStack_1e50[0].seqtree);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b689;
        aVar20.seqtree = (btree *)&(aVar20.seqtree)->vsize;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar17.seqtree != aVar20.seqtree);
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5b5;
      fVar2 = fdb_commit(pfStack_1f08,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6a2;
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5c7;
      fdb_close(pfStack_1f08);
      lVar16 = 0;
      do {
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5d6;
        fdb_doc_free((fdb_doc *)aaStack_1e50[lVar16].seqtree);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x14);
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5ee;
      fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStack_1ef0,(uint64_t)pfStack_1ef8);
      aVar20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x14;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5fb;
        fdb_shutdown();
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b600;
        memleak_end();
        pcVar32 = "single kv mode:";
        if ((char)uVar14 != '\0') {
          pcVar32 = "multiple kv mode:";
        }
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b62e;
        sprintf(acStack_1bb0,"rollback all test %s",pcVar32);
        pcVar32 = "%s PASSED\n";
        if (rollback_all_test(bool)::__test_pass != '\0') {
          pcVar32 = "%s FAILED\n";
        }
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b65b;
        iVar4 = fprintf(_stderr,pcVar32,acStack_1bb0);
        return iVar4;
      }
      goto LAB_0011b6a7;
    }
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6ac;
    aVar20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x0;
    do {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b372;
      fdb_kvs_close((fdb_kvs_handle *)aaStack_1ee0[(long)aVar20].seqtree);
      aVar20.seqtree = aVar20.seqtree + 1;
    } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar17.seqtree != aVar20.seqtree);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b396;
    fVar2 = fdb_open((fdb_file_handle **)&fStack_1e90,"./mvcc_test6",
                     (fdb_config *)(acStack_1bb0 + 0x100));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b1;
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3bc;
    fVar2 = fdb_kvs_open((fdb_file_handle *)fStack_1e90.name,(fdb_kvs_handle **)&aStack_1ee8.seqtree
                         ,"kv0",(fdb_kvs_config *)(acStack_1eb0 + 8));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b6;
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3d7;
    fVar2 = fdb_rollback_all(pfStack_1f08,(fdb_snapshot_marker_t)pfStack_1ef0->kvs);
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6bb;
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3ea;
    fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_1ee8.seqtree);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6c0;
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3ff;
    fVar2 = fdb_close((fdb_file_handle *)fStack_1e90.name);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b41a;
      fVar2 = fdb_rollback_all(pfStack_1f08,(fdb_snapshot_marker_t)pfStack_1ef0->kvs);
      goto LAB_0011b41a;
    }
  }
  else {
LAB_0011b698:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b69d;
    rollback_all_test();
LAB_0011b69d:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6a2;
    rollback_all_test();
LAB_0011b6a2:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6a7;
    rollback_all_test();
LAB_0011b6a7:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6ac;
    rollback_all_test();
LAB_0011b6ac:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6b1;
    rollback_all_test();
LAB_0011b6b1:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6b6;
    rollback_all_test();
LAB_0011b6b6:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6bb;
    rollback_all_test();
LAB_0011b6bb:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6c0;
    rollback_all_test();
LAB_0011b6c0:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6c5;
    rollback_all_test();
  }
  aStack_1f18.seqtree = (btree *)auto_compaction_snapshots_test;
  rollback_all_test();
  aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6e7;
  aStack_1f40 = aVar20;
  aStack_1f38 = handle_00;
  aStack_1f30 = unaff_R13;
  phStack_1f28 = (hbtrie_func_readkey *)pcVar28;
  aStack_1f20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar32;
  aStack_1f18 = aVar17;
  gettimeofday(&tStack_2098,(__timezone_ptr_t)0x0);
  aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6ec;
  memleak_start();
  puVar29 = &uStack_20dc;
  uStack_20dc = 0;
  aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b704;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig.seqtree = (btree *)auStack_2038;
  aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b714;
  fdb_get_default_config();
  uStack_200a = 1;
  uStack_2018 = 1;
  pcStack_1fe0 = compaction_cb_count;
  uStack_1fd8 = 0x20;
  uStack_2000 = 1;
  aVar20.seqtree = (btree *)0x156054;
  aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b74e;
  puStack_1fd0 = puVar29;
  fVar2 = fdb_open(&pfStack_20e8,"mvcc_test1",(fdb_config *)fconfig.seqtree);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig.seqtree = (btree *)afStack_20d8;
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b763;
    fdb_get_default_kvs_config();
    fStack_2088.custom_cmp_param = afStack_20d8[0].custom_cmp_param;
    fStack_2088.create_if_missing = afStack_20d8[0].create_if_missing;
    fStack_2088._1_7_ = afStack_20d8[0]._1_7_;
    fStack_2088.custom_cmp = afStack_20d8[0].custom_cmp;
    aVar20.seqtree = (btree *)&aStack_20f0;
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b788;
    fVar2 = fdb_kvs_open_default(pfStack_20e8,(fdb_kvs_handle **)aVar20.seqtree,&fStack_2088);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba6f;
    unaff_R13.seqtree = (btree *)0x156958;
    handle_00.seqtree = (btree *)0x0;
    do {
      pcVar32 = (char *)0xcccccccd;
      aVar18.seqtree = (btree *)0x1565bd;
      aVar20.seqtree = (btree *)afStack_20d8;
      iVar4 = handle_00._0_4_;
      aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7bc;
      sprintf((char *)aVar20.seqtree,"%d",handle_00.seqtree);
      aVar17 = aStack_20f0;
      aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7c9;
      sVar6 = strlen((char *)aVar20.seqtree);
      aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7e0;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar17.seqtree,aVar20.seqtree,sVar6,"value",5);
      aVar19.seqtree = unaff_R13.seqtree;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba28;
        auto_compaction_snapshots_test();
LAB_0011ba28:
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba2d;
        auto_compaction_snapshots_test();
LAB_0011ba2d:
        fconfig = aVar17;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba32;
        auto_compaction_snapshots_test();
LAB_0011ba32:
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba37;
        auto_compaction_snapshots_test();
LAB_0011ba37:
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba3c;
        auto_compaction_snapshots_test();
        unaff_R13 = aVar19;
        doc_02 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar32;
LAB_0011ba3c:
        aVar19 = unaff_R13;
        unaff_R13 = aVar18;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba41;
        auto_compaction_snapshots_test();
LAB_0011ba41:
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba4e;
        auto_compaction_snapshots_test();
LAB_0011ba4e:
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba5b;
        aVar20 = fconfig;
        auto_compaction_snapshots_test();
LAB_0011ba5b:
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba60;
        auto_compaction_snapshots_test();
        aVar17 = unaff_R13;
        pcVar32 = (char *)doc_02;
LAB_0011ba60:
        unaff_R13 = aVar19;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba65;
        auto_compaction_snapshots_test();
LAB_0011ba65:
        puVar29 = (uint *)afStack_20d8;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba6a;
        auto_compaction_snapshots_test();
        goto LAB_0011ba6a;
      }
      aVar17 = handle_00;
      if ((int)((ulong)handle_00.seqtree / 10) * 10 == iVar4) {
        aVar20.seqtree = (btree *)0x0;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b80c;
        fVar2 = fdb_commit(pfStack_20e8,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba28;
      }
      fconfig = handle_00;
      if ((int)((ulong)handle_00.seqtree / 100) * 100 == iVar4) {
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b83d;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aStack_20f0.seqtree,&fStack_2068);
        fconfig = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)fStack_2068.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba2d;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b85f;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_20f0.seqtree,&pfStack_20f8,
                                  fStack_2068.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba37;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b885;
        fdb_doc_create((fdb_doc **)&aStack_2100.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_2100.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b898;
        fVar2 = fdb_get_byseq(pfStack_20f8,(fdb_doc *)aStack_2100.seqtree);
        aVar19 = aStack_2100;
        doc_02.seqtree = (btree *)pcVar32;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba3c;
        pcVar32 = (char *)(aStack_2100.seqtrie)->aux;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8b9;
        sVar6 = strlen(&afStack_20d8[0].create_if_missing);
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8c7;
        iVar3 = bcmp(pcVar32,afStack_20d8,sVar6);
        doc_02 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar32;
        if (iVar3 != 0) goto LAB_0011ba41;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8d7;
        fdb_doc_free((fdb_doc *)aVar19.seqtree);
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8e1;
        fVar2 = fdb_kvs_close(pfStack_20f8);
        aVar18.seqtree = unaff_R13.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba32;
        aVar20.seqtree = (btree *)&pfStack_20f8;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8ff;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_20f0.seqtree,
                                  (fdb_kvs_handle **)aVar20.seqtree,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba5b;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b925;
        fdb_doc_create((fdb_doc **)&aStack_2100.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_2100.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b938;
        aVar20 = aStack_2100;
        fVar2 = fdb_get_byseq(pfStack_20f8,(fdb_doc *)aStack_2100.seqtree);
        doc_02 = aStack_2100;
        aVar17.seqtree = unaff_R13.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba60;
        fconfig = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(aStack_2100.seqtrie)->aux;
        aVar20.seqtree = (btree *)afStack_20d8;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b956;
        sVar6 = strlen((char *)aVar20.seqtree);
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b964;
        iVar3 = bcmp(fconfig.seqtree,aVar20.seqtree,sVar6);
        if (iVar3 != 0) goto LAB_0011ba4e;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b974;
        fdb_doc_free((fdb_doc *)doc_02.seqtree);
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b97e;
        fVar2 = fdb_kvs_close(pfStack_20f8);
        pcVar32 = (char *)0xcccccccd;
        aVar17.seqtree = (btree *)0x1565bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011b996;
        goto LAB_0011ba65;
      }
LAB_0011b996:
      puVar29 = (uint *)afStack_20d8;
      pcVar32 = (char *)0xcccccccd;
      aVar17.seqtree = (btree *)0x1565bd;
      handle_00._0_4_ = iVar4 + 1;
      handle_00._4_4_ = 0;
    } while (handle_00._0_4_ != 100000);
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9b0;
    fVar2 = fdb_close(pfStack_20e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba74;
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9bd;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9ca;
      memleak_end();
      aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9e4;
      sprintf(&afStack_20d8[0].create_if_missing,"auto compaction completed %d times with snapshots"
              ,(ulong)uStack_20dc);
      pcVar32 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar32 = "%s FAILED\n";
      }
      aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba11;
      iVar4 = fprintf(_stderr,pcVar32,afStack_20d8);
      return iVar4;
    }
  }
  else {
LAB_0011ba6a:
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba6f;
    auto_compaction_snapshots_test();
LAB_0011ba6f:
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba74;
    auto_compaction_snapshots_test();
LAB_0011ba74:
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba79;
    auto_compaction_snapshots_test();
  }
  aStack_2110.seqtree = (btree *)compaction_cb_count;
  auto_compaction_snapshots_test();
  aVar19.seqtree = aVar20.seqtree & 0xffffffff;
  __tv = &tStack_2128;
  aStack_2138 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba95;
  aStack_2118 = fconfig;
  aStack_2110 = aVar17;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if (aVar20._0_4_ == 0x20) {
    if (extraout_RDX == 0) {
      *(int *)&(aStack_2100.seqtree)->ksize = *(int *)&(aStack_2100.seqtree)->ksize + 1;
      return 0;
    }
  }
  else {
    aStack_2138 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bab4;
    compaction_cb_count();
  }
  aStack_2138.seqtree = (btree *)rollback_during_ops_test;
  compaction_cb_count();
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bad9;
  aStack_2158 = handle_00;
  aStack_2150 = unaff_R13;
  puStack_2148 = puVar29;
  aStack_2140 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar32;
  aStack_2138.seqtree = aVar19.seqtree;
  gettimeofday((timeval *)(acStack_238f + 0x2f),(__timezone_ptr_t)0x0);
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bade;
  memleak_start();
  iStack_23ac = 10000;
  if (__tv == (timeval *)0x0) {
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bafb;
    system("rm -rf  mvcc_test* > errorlog.txt");
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb08;
    fdb_get_default_config();
    fconfig_01 = &fStack_2258;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb20;
    memcpy(fconfig_01,auStack_2350,0xf8);
    fStack_2258.block_reusing_threshold = 0;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb3f;
    fVar2 = fdb_open(&pfStack_23a0,"mvcc_test1",fconfig_01);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb54;
      fdb_get_default_kvs_config();
      uStack_2368 = uStack_2340;
      pcStack_2378 = (char *)auStack_2350._0_8_;
      pfStack_2370 = (fdb_config *)auStack_2350._8_8_;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb76;
      fVar2 = fdb_kvs_open_default
                        (pfStack_23a0,(fdb_kvs_handle **)&aStack_23a8.seqtree,
                         (fdb_kvs_config *)(acStack_238f + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf9d;
      if (0 < iStack_23ac) {
        unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
        __tv = (timeval *)CONCAT71((int7)((ulong)auStack_2350 >> 8),1);
        uVar14 = 0;
        do {
          aVar19._0_4_ = uVar14 + 1;
          aVar19._4_4_ = 0;
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbb0;
          sprintf(acStack_238f,"%d",aVar19.seqtree);
          handle_00 = aStack_23a8;
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbbd;
          sVar6 = strlen(acStack_238f);
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbd8;
          fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,acStack_238f,sVar6,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be65;
            rollback_during_ops_test();
            goto LAB_0011be65;
          }
          ptVar12 = __tv;
          if ((int)((ulong)unaff_R13.seqtree / 10) * 10 - 1U == uVar14) {
            ptVar12 = (timeval *)((ulong)__tv & 0xffffffff ^ 1);
            aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc18;
            fdb_commit(pfStack_23a0,~(byte)__tv & 1);
          }
          unaff_R13._0_4_ = unaff_R13._0_4_ + 1;
          unaff_R13._4_4_ = 0;
          __tv = ptVar12;
          uVar14 = aVar19._0_4_;
        } while ((int)aVar19._0_4_ < iStack_23ac);
      }
      aVar19 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc3f;
      fdb_commit(pfStack_23a0,'\x01');
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc4e;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_23a8.seqtree,(fdb_kvs_info *)auStack_2350);
      __tv = (timeval *)(auStack_2350 + 8);
      if ((fdb_config *)auStack_2350._8_8_ != (fdb_config *)(long)iStack_23ac) {
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc6a;
        rollback_during_ops_test();
      }
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc82;
      pthread_create(&pStack_2398,(pthread_attr_t *)0x0,rollback_during_ops_test,&iStack_23ac);
      fconfig_01 = (fdb_config *)0x156958;
      pcVar32 = acStack_238f;
      handle_00.seqtree = (btree *)0x1565bd;
      do {
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bca4;
        sprintf(pcVar32,"%d",aVar19.seqtree);
        unaff_R13 = aStack_23a8;
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcb1;
        sVar6 = strlen(pcVar32);
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcc8;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)unaff_R13.seqtree,pcVar32,sVar6,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011be65;
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bce4;
          fVar2 = fdb_commit(pfStack_23a0,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011be6a;
        }
        aVar19._0_4_ = aVar19._0_4_ + 1;
        aVar19._4_4_ = 0;
      } while (aVar19._0_4_ != 0x2711);
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd0a;
      pthread_join(pStack_2398,(void **)(acStack_238f + 0xf));
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd2d;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_23a8.seqtree,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa2;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd44;
      fVar2 = fdb_commit(pfStack_23a0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa7;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd5e;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_23a8.seqtree,(fdb_kvs_info *)auStack_2350);
      fconfig_01 = (fdb_config *)auStack_2350._8_8_;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd85;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_23a8.seqtree,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfac;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdb0;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_23a8.seqtree,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb1;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdc7;
      fVar2 = fdb_commit(pfStack_23a0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb6;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bddc;
      fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_23a8.seqtree,(fdb_seqnum_t)fconfig_01);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdf6;
        fdb_get_kvs_info((fdb_kvs_handle *)aStack_23a8.seqtree,(fdb_kvs_info *)auStack_2350);
        if ((fdb_config *)auStack_2350._8_8_ != fconfig_01) {
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be07;
          rollback_during_ops_test();
        }
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be11;
        fdb_close(pfStack_23a0);
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be16;
        fdb_shutdown();
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be1b;
        memleak_end();
        pcVar32 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar32 = "%s FAILED\n";
        }
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be4c;
        fprintf(_stderr,pcVar32,"rollback during ops test");
        return 0;
      }
    }
    else {
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf9d;
      rollback_during_ops_test();
LAB_0011bf9d:
      __tv = (timeval *)auStack_2350;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfa2;
      rollback_during_ops_test();
LAB_0011bfa2:
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfa7;
      rollback_during_ops_test();
LAB_0011bfa7:
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfac;
      rollback_during_ops_test();
LAB_0011bfac:
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb1;
      rollback_during_ops_test();
LAB_0011bfb1:
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb6;
      rollback_during_ops_test();
LAB_0011bfb6:
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfbb;
      rollback_during_ops_test();
    }
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfc0;
    rollback_during_ops_test();
LAB_0011bfc0:
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfc5;
    rollback_during_ops_test();
  }
  else {
LAB_0011be6f:
    fconfig_01 = (fdb_config *)auStack_2350;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be7c;
    fdb_get_default_config();
    pcVar32 = (char *)&fStack_2258;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be94;
    memcpy(pcVar32,fconfig_01,0xf8);
    fStack_2258.block_reusing_threshold = 0;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11beb3;
    fVar2 = fdb_open(&pfStack_23a0,"mvcc_test1",(fdb_config *)pcVar32);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfc0;
    fconfig_01 = (fdb_config *)auStack_2350;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bec8;
    fdb_get_default_kvs_config();
    uStack_2368 = uStack_2340;
    pcStack_2378 = (char *)auStack_2350._0_8_;
    pfStack_2370 = (fdb_config *)auStack_2350._8_8_;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11beeb;
    fVar2 = fdb_kvs_open_default
                      (pfStack_23a0,(fdb_kvs_handle **)&aStack_23a8.seqtree,
                       (fdb_kvs_config *)(acStack_238f + 0x17));
    if (fVar2 == FDB_RESULT_SUCCESS) {
      iStack_23ac = (int)__tv->tv_sec;
      if (1 < (long)iStack_23ac) {
        unaff_R13.seqtree = (btree *)0xcccccccd;
        fconfig_01 = (fdb_config *)0x156958;
        pcVar32 = acStack_238f;
        handle_00.seqtree = (btree *)0x1565bd;
        __tv = (timeval *)(long)iStack_23ac;
        do {
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf2c;
          sprintf(pcVar32,"%d",(ulong)__tv & 0xffffffff);
          aVar19 = aStack_23a8;
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf39;
          sVar6 = strlen(pcVar32);
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf50;
          fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar19.seqtree,pcVar32,sVar6,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfca;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf76;
            fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_23a8.seqtree,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfcf;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf91;
      fdb_close(pfStack_23a0);
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf98;
      pthread_exit((void *)0x0);
    }
  }
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfca;
  rollback_during_ops_test();
LAB_0011bfca:
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfcf;
  rollback_during_ops_test();
LAB_0011bfcf:
  aStack_23c0.seqtree = (btree *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bff0;
  ptStack_23e0 = __tv;
  aStack_23d8 = handle_00;
  aStack_23d0 = unaff_R13;
  pfStack_23c8 = fconfig_01;
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar32;
  gettimeofday((timeval *)(auStack_253f + 0xf),(__timezone_ptr_t)0x0);
  aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bff5;
  memleak_start();
  aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c001;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = &fStack_24d8;
  aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c011;
  fdb_get_default_config();
  aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c025;
  fVar2 = fdb_open(&pfStack_2560,"mvcc_test1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00 = (fdb_config *)(auStack_2520 + 0x30);
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c03d;
    fdb_get_default_kvs_config();
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c04f;
    fVar2 = fdb_kvs_open_default
                      (pfStack_2560,(fdb_kvs_handle **)&aStack_2568.seqtree,
                       (fdb_kvs_config *)fconfig_00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c270;
    fconfig_00 = (fdb_config *)0x1;
    fconfig_01 = (fdb_config *)0x156958;
    pcVar32 = auStack_253f;
    handle_00.seqtree = (btree *)0x1565bd;
    do {
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c07e;
      sprintf(pcVar32,"%d",fconfig_00);
      unaff_R13 = aStack_2568;
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c08b;
      sVar6 = strlen(pcVar32);
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0a2;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)unaff_R13.seqtree,pcVar32,sVar6,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c266;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c266;
      }
      uVar14 = (int)fconfig_00 + 1;
      fconfig_00 = (fdb_config *)(ulong)uVar14;
    } while (uVar14 != 4);
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0bd;
    fdb_commit(pfStack_2560,'\0');
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0e0;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2568.seqtree,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c275;
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c10b;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2568.seqtree,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27a;
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c122;
    fVar2 = fdb_commit(pfStack_2560,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27f;
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c139;
    fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2568.seqtree,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c284;
    fconfig_00 = (fdb_config *)auStack_2520;
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c153;
    fdb_get_kvs_info((fdb_kvs_handle *)aStack_2568.seqtree,(fdb_kvs_info *)fconfig_00);
    if (auStack_2520._8_8_ != 3) {
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c164;
      in_memory_snapshot_rollback_test();
    }
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c17a;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2568.seqtree,&pfStack_2548,0xffffffffffffffff
                             );
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c289;
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1a2;
    fdb_iterator_init(pfStack_2548,&pfStack_2558,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_00 = (fdb_config *)&pfStack_2550;
    pfStack_2550 = (fdb_doc *)0x0;
    fconfig_01 = (fdb_config *)0x3;
    do {
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1c1;
      fVar2 = fdb_iterator_get(pfStack_2558,(fdb_doc **)fconfig_00);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c266;
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1d3;
      fdb_doc_free(pfStack_2550);
      pfStack_2550 = (fdb_doc *)0x0;
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1e6;
      fVar2 = fdb_iterator_next(pfStack_2558);
      fconfig_01 = (fdb_config *)&fconfig_01[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_01 == (fdb_config *)0x0) {
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c201;
      fdb_iterator_close(pfStack_2558);
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c20b;
      fdb_kvs_close(pfStack_2548);
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c215;
      fdb_close(pfStack_2560);
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c21a;
      fdb_shutdown();
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c21f;
      memleak_end();
      pcVar32 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar32 = "%s FAILED\n";
      }
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c250;
      iVar4 = fprintf(_stderr,pcVar32,"in-memory snapshot rollback test");
      return iVar4;
    }
  }
  else {
LAB_0011c26b:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c270;
    in_memory_snapshot_rollback_test();
LAB_0011c270:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c275;
    in_memory_snapshot_rollback_test();
LAB_0011c275:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c27a;
    in_memory_snapshot_rollback_test();
LAB_0011c27a:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c27f;
    in_memory_snapshot_rollback_test();
LAB_0011c27f:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c284;
    in_memory_snapshot_rollback_test();
LAB_0011c284:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c289;
    in_memory_snapshot_rollback_test();
LAB_0011c289:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c28e;
    in_memory_snapshot_rollback_test();
  }
  aStack_2578.seqtree = (btree *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_4a30 = (code *)0x11c2b0;
  pfStack_25a0 = fconfig_00;
  aStack_2598 = handle_00;
  aStack_2590 = unaff_R13;
  pfStack_2588 = fconfig_01;
  aStack_2580 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar32;
  aStack_2578 = aVar19;
  gettimeofday(&tStack_49b8,(__timezone_ptr_t)0x0);
  pcStack_4a30 = (code *)0x11c2b5;
  memleak_start();
  pcStack_4a30 = (code *)0x11c2c1;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_4a30 = (code *)0x11c2d1;
  fdb_get_default_config();
  pcStack_4a30 = (code *)0x11c2db;
  fdb_get_default_kvs_config();
  fStack_48a0.wal_threshold = 0x400;
  fStack_48a0.compaction_mode = 0;
  fStack_48a0.durability_opt = 2;
  pfVar9 = (fdb_kvs_handle *)(apfStack_46a8 + 0x20);
  ppfVar13 = apfStack_49a8;
  pcVar32 = "kvs%d";
  uVar5 = 0;
  ppfVar30 = (fdb_kvs_handle **)0x0;
  do {
    pcStack_4a30 = (code *)0x11c31b;
    sprintf((char *)ppfVar13,"mvcc_test%d",(ulong)ppfVar30 & 0xffffffff);
    pcVar28 = (char *)(apfStack_4a18 + (long)ppfVar30);
    pcStack_4a30 = (code *)0x11c336;
    ppfVar24 = (fdb_kvs_handle **)pcVar28;
    fVar2 = fdb_open((fdb_file_handle **)pcVar28,(char *)ppfVar13,
                     (fdb_config *)(apfStack_49a8 + 0x21));
    iVar4 = (int)ppfVar24;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c685;
    ppfVar24 = (fdb_kvs_handle **)0x0;
    ppfStack_4a28 = ppfVar30;
    pfStack_4a20 = pfVar9;
    do {
      ppfVar30 = ppfVar24;
      pcStack_4a30 = (code *)0x11c35b;
      sprintf((char *)ppfVar13,"kvs%d",(ulong)(uint)((int)ppfVar30 + (int)uVar5));
      pfVar34 = *(fdb_kvs_handle **)pcVar28;
      pcStack_4a30 = (code *)0x11c36e;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar34,(fdb_kvs_handle **)pfVar9,(char *)ppfVar13,
                           (fdb_kvs_config *)(apfStack_4a18 + 9));
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_4a30 = (code *)0x11c67b;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c67b;
      }
      pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).custom_cmp;
      ppfVar24 = (fdb_kvs_handle **)((long)ppfVar30 + 1);
    } while ((char *)((long)ppfVar30 + 1) != (char *)0x80);
    ppfVar30 = (fdb_kvs_handle **)((long)ppfStack_4a28 + 1);
    uVar5 = uVar5 + 0x80;
    pfVar9 = (fdb_kvs_handle *)&pfStack_4a20[1].bub_ctx.space_used;
  } while (ppfVar30 != (fdb_kvs_handle **)0x8);
  ppfVar30 = apfStack_49a8 + 0x40;
  ppfVar13 = apfStack_46a8;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    uVar5 = 0;
    do {
      pcStack_4a30 = (code *)0x11c3cf;
      sprintf((char *)ppfVar30,"key%08d",uVar5);
      pcStack_4a30 = (code *)0x11c3e2;
      sprintf((char *)ppfVar13,"value%08d",uVar5);
      pcVar32 = (char *)apfStack_46a8[(long)&pfVar9->op_stats];
      pcStack_4a30 = (code *)0x11c3f2;
      sVar6 = strlen((char *)ppfVar30);
      pcVar28 = (char *)(sVar6 + 1);
      pcStack_4a30 = (code *)0x11c3fe;
      sVar6 = strlen((char *)ppfVar13);
      pcStack_4a30 = (code *)0x11c413;
      pfVar34 = (fdb_kvs_handle *)pcVar32;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar32,ppfVar30,(size_t)pcVar28,ppfVar13,sVar6 + 1);
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c67b;
      uVar14 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar14;
    } while (uVar14 != 10);
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  pcVar28 = (char *)0x0;
  do {
    pfVar34 = apfStack_4a18[(long)pcVar28];
    if (((ulong)pcVar28 & 1) == 0) {
      pcStack_4a30 = (code *)0x11c441;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar34,'\0');
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a3;
    }
    else {
      pcStack_4a30 = (code *)0x11c454;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar34,'\x01');
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a8;
    }
    pcVar28 = (char *)((long)pcVar28 + 1);
  } while (pcVar28 != (char *)0x8);
  pcVar28 = "key%08d";
  ppfVar30 = apfStack_49a8 + 0x40;
  ppfVar13 = (fdb_kvs_handle **)0x0;
  do {
    uVar5 = 0;
    do {
      pcStack_4a30 = (code *)0x11c488;
      sprintf((char *)ppfVar30,"key%08d",uVar5);
      pfVar9 = apfStack_46a8[(long)(ppfVar13 + 4)];
      pcStack_4a30 = (code *)0x11c498;
      sVar6 = strlen((char *)ppfVar30);
      pcStack_4a30 = (code *)0x11c4a7;
      pfVar34 = pfVar9;
      fVar2 = fdb_del_kv(pfVar9,ppfVar30,sVar6 + 1);
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c680;
      uVar14 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar14;
    } while (uVar14 != 10);
    ppfVar13 = (fdb_kvs_handle **)((long)ppfVar13 + 1);
  } while (ppfVar13 != (fdb_kvs_handle **)0x400);
  pcVar28 = (char *)0x0;
  do {
    pfVar34 = apfStack_4a18[(long)pcVar28];
    if (((ulong)pcVar28 & 1) == 0) {
      pcStack_4a30 = (code *)0x11c4d5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar34,'\0');
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6ad;
    }
    else {
      pcStack_4a30 = (code *)0x11c4e8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar34,'\x01');
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b2;
    }
    pcVar28 = (char *)((long)pcVar28 + 1);
  } while (pcVar28 != (char *)0x8);
  ppfVar30 = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar28 = (char *)(apfStack_46a8 + 0x20);
  do {
    pcStack_4a30 = (code *)0x11c515;
    ppfVar24 = (fdb_kvs_handle **)pcVar28;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar28,10);
    iVar4 = (int)ppfVar24;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68a;
    ppfVar30 = ppfVar30 + 8;
    pcVar28 = (char *)((long)pcVar28 + 0x200);
  } while (ppfVar30 < (fdb_kvs_handle **)0x3c0);
  ppfVar13 = apfStack_4a18;
  pcVar28 = "kvs%d";
  ppfVar30 = apfStack_49a8;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfVar34 = apfStack_46a8[(long)&pfVar9->op_stats];
    pcStack_4a30 = (code *)0x11c555;
    fVar2 = fdb_kvs_close(pfVar34);
    iVar4 = (int)pfVar34;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c694;
    pcStack_4a30 = (code *)0x11c56d;
    sprintf((char *)ppfVar30,"kvs%d",(ulong)pfVar9 & 0xffffffff);
    pfVar34 = *ppfVar13;
    pcStack_4a30 = (code *)0x11c579;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar34,(char *)ppfVar30);
    iVar4 = (int)pfVar34;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68f;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->config).wal_threshold;
    ppfVar13 = ppfVar13 + 1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  pcVar28 = (char *)0x0;
  do {
    pfVar34 = apfStack_4a18[(long)pcVar28];
    if (((ulong)pcVar28 & 1) == 0) {
      pcStack_4a30 = (code *)0x11c5a5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar34,'\0');
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b7;
    }
    else {
      pcStack_4a30 = (code *)0x11c5b8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar34,'\x01');
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6bc;
    }
    pcVar28 = (char *)((long)pcVar28 + 1);
  } while (pcVar28 != (char *)0x8);
  pcVar28 = "mvcc_test_compact%d";
  ppfVar30 = apfStack_49a8;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_4a30 = (code *)0x11c5eb;
    sprintf((char *)ppfVar30,"mvcc_test_compact%d",(ulong)pfVar9 & 0xffffffff);
    pfVar34 = apfStack_4a18[(long)pfVar9];
    pcStack_4a30 = (code *)0x11c5f8;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar34,(char *)ppfVar30);
    iVar4 = (int)pfVar34;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c699;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x8);
  pcVar28 = (char *)0x0;
  pcStack_4a30 = (code *)0x11c612;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar34 = apfStack_4a18[(long)pcVar28];
    pcStack_4a30 = (code *)0x11c61c;
    fVar2 = fdb_close((fdb_file_handle *)pfVar34);
    iVar4 = (int)pfVar34;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar28 = (char *)((long)pcVar28 + 1);
    if (pcVar28 == (char *)0x8) {
      pcStack_4a30 = (code *)0x11c62e;
      fdb_shutdown();
      pcStack_4a30 = (code *)0x11c633;
      memleak_end();
      pcVar32 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar32 = "%s FAILED\n";
      }
      pcStack_4a30 = (code *)0x11c664;
      iVar4 = fprintf(_stderr,pcVar32,"open multi files kvs test");
      return iVar4;
    }
  }
LAB_0011c69e:
  pcStack_4a30 = (code *)0x11c6a3;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a3:
  pcStack_4a30 = (code *)0x11c6a8;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a8:
  pcStack_4a30 = (code *)0x11c6ad;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6ad:
  pcStack_4a30 = (code *)0x11c6b2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b2:
  pcStack_4a30 = (code *)0x11c6b7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b7:
  pcStack_4a30 = (code *)0x11c6bc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6bc:
  pcStack_4a30 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_4f38 = (code *)0x11c6e3;
  ppfStack_4a58 = (fdb_kvs_handle **)pcVar28;
  ppfStack_4a50 = ppfVar13;
  pfStack_4a48 = (fdb_kvs_handle *)pcVar32;
  ppfStack_4a40 = ppfVar30;
  pfStack_4a38 = pfVar9;
  pcStack_4a30 = (code *)uVar5;
  gettimeofday(&tStack_4eb0,(__timezone_ptr_t)0x0);
  pcStack_4f38 = (code *)0x11c6e8;
  memleak_start();
  pcStack_4f38 = (code *)0x11c6f8;
  fdb_get_default_config();
  pcStack_4f38 = (code *)0x11c702;
  fdb_get_default_kvs_config();
  fStack_4b50.flags = 1;
  fStack_4b50.block_reusing_threshold = 0;
  fStack_4b50.seqtree_opt = 0;
  pcStack_4f38 = (code *)0x11c728;
  fStack_4b50.multi_kv_instances = (bool)(char)iVar4;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_4f38 = (code *)0x11c73c;
  fdb_open((fdb_file_handle **)&pfStack_4f20,"./mvcc_test1",(fdb_config *)(acStack_4c50 + 0x100));
  iStack_4efc = iVar4;
  if (iVar4 == 0) {
    pcStack_4f38 = (code *)0x11c7a8;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_4f20,apfStack_4ef0,&fStack_4ed0);
    pcVar32 = (char *)0x1;
  }
  else {
    ppfVar13 = apfStack_4ef0;
    uVar5 = 0;
    do {
      pcStack_4f38 = (code *)0x11c76d;
      sprintf(acStack_4eb8,"kv%d",uVar5 & 0xffffffff);
      pcStack_4f38 = (code *)0x11c780;
      fdb_kvs_open((fdb_file_handle *)pfStack_4f20,ppfVar13,acStack_4eb8,&fStack_4ed0);
      uVar5 = uVar5 + 1;
      ppfVar13 = ppfVar13 + 1;
    } while (uVar5 != 3);
    pcVar32 = (char *)0x3;
  }
  uStack_4f24 = 0;
  do {
    uVar5 = 0;
    do {
      pcStack_4f38 = (code *)0x11c7d4;
      sprintf(acStack_4d50,"key%d",uVar5 & 0xffffffff);
      pcStack_4f38 = (code *)0x11c7f5;
      sprintf(acStack_4ea0,"meta-%d-%d",(ulong)uStack_4f24,uVar5 & 0xffffffff);
      pcStack_4f38 = (code *)0x11c814;
      sprintf(acStack_4c50,"body-%d-%d",(ulong)uStack_4f24,uVar5 & 0xffffffff);
      doc_00 = (btree *)(&bStack_4da0.ksize + uVar5 * 8);
      pcStack_4f38 = (code *)0x11c827;
      sVar6 = strlen(acStack_4d50);
      pcStack_4f38 = (code *)0x11c837;
      metalen._M_i = strlen(acStack_4ea0);
      pcStack_4f38 = (code *)0x11c842;
      sVar7 = strlen(acStack_4c50);
      pcStack_4f38 = (code *)0x11c867;
      fdb_doc_create((fdb_doc **)doc_00,acStack_4d50,sVar6,acStack_4ea0,metalen._M_i,acStack_4c50,
                     sVar7);
      pfVar9 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_4f38 = (code *)0x11c878;
        fdb_set(apfStack_4ef0[(long)pfVar9],*(fdb_doc **)doc_00);
        pfVar9 = (fdb_kvs_handle *)((long)pfVar9 + 1);
      } while ((fdb_kvs_handle *)pcVar32 != pfVar9);
      pcStack_4f38 = (code *)0x11c88d;
      fdb_doc_free(*(fdb_doc **)(&bStack_4da0.ksize + uVar5 * 8));
      uVar5 = uVar5 + 1;
    } while (uVar5 != 10);
    pcStack_4f38 = (code *)0x11c8b1;
    fdb_commit((fdb_file_handle *)pfStack_4f20,~(byte)uStack_4f24 & 1);
    uStack_4f24 = uStack_4f24 + 1;
    pcVar28 = (char *)(ulong)uStack_4f24;
  } while (uStack_4f24 != 5);
  pcStack_4f38 = (code *)0x11c8d4;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_4f20,&pfStack_4f08,&uStack_4ed8);
  pfVar34 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_4f38 = (code *)0x11c8f3;
    fVar2 = fdb_rollback(apfStack_4ef0,(pfStack_4f08[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbd7;
    pfStack_4f18 = (fdb_kvs_handle *)0x0;
    pcVar28 = acStack_4c50;
    pfVar34 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_4f38 = (code *)0x11c928;
      fVar2 = fdb_snapshot_open(apfStack_4ef0[(long)pfVar34],&pfStack_4ef8,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb9:
        pcStack_4f38 = (code *)0x11cbbe;
        rollback_without_seqtree();
LAB_0011cbbe:
        pcStack_4f38 = (code *)0x11cbc3;
        rollback_without_seqtree();
LAB_0011cbc3:
        pcStack_4f38 = (code *)0x11cbc8;
        rollback_without_seqtree();
LAB_0011cbc8:
        pcStack_4f38 = (code *)0x11cbcd;
        rollback_without_seqtree();
        goto LAB_0011cbcd;
      }
      pcStack_4f38 = (code *)0x11c950;
      fVar2 = fdb_iterator_init(pfStack_4ef8,&pfStack_4f10,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb4:
        pcStack_4f38 = (code *)0x11cbb9;
        rollback_without_seqtree();
        goto LAB_0011cbb9;
      }
      metalen._M_i = 0;
      do {
        pcStack_4f38 = (code *)0x11c96a;
        fVar2 = fdb_iterator_get(pfStack_4f10,(fdb_doc **)&pfStack_4f18);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cb8f:
          pcStack_4f38 = (code *)0x11cb94;
          rollback_without_seqtree();
LAB_0011cb94:
          pcStack_4f38 = (code *)0x11cba4;
          rollback_without_seqtree();
LAB_0011cba4:
          pcStack_4f38 = (code *)0x11cbb4;
          rollback_without_seqtree();
          goto LAB_0011cbb4;
        }
        pcStack_4f38 = (code *)0x11c98b;
        sprintf(acStack_4d50,"key%d",metalen._M_i);
        if (pfVar34 == (fdb_kvs_handle *)0x0) {
          pcStack_4f38 = (code *)0x11c9da;
          sprintf(acStack_4ea0,"meta-1-%d",metalen._M_i);
          pcStack_4f38 = (code *)0x11c9ee;
          sprintf(pcVar28,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_4f38 = (code *)0x11c9ae;
          sprintf(acStack_4ea0,"meta-%d-%d",4,metalen._M_i);
          pcStack_4f38 = (code *)0x11c9c7;
          sprintf(pcVar28,"body-%d-%d",4);
        }
        pfVar9 = pfStack_4f18;
        doc_00 = (btree *)pfStack_4f18->op_stats;
        pcStack_4f38 = (code *)0x11ca0a;
        iVar4 = bcmp(doc_00,acStack_4d50,*(size_t *)&pfStack_4f18->kvs_config);
        if (iVar4 != 0) {
          pcStack_4f38 = (code *)0x11cb8f;
          rollback_without_seqtree();
          goto LAB_0011cb8f;
        }
        doc_00 = pfVar9->staletree;
        pcStack_4f38 = (code *)0x11ca2a;
        iVar4 = bcmp(doc_00,acStack_4ea0,(size_t)(pfVar9->kvs_config).custom_cmp);
        if (iVar4 != 0) goto LAB_0011cba4;
        doc_00 = (pfVar9->field_6).seqtree;
        pcStack_4f38 = (code *)0x11ca45;
        iVar4 = bcmp(doc_00,pcVar28,(size_t)(pfVar9->kvs_config).custom_cmp_param);
        if (iVar4 != 0) goto LAB_0011cb94;
        pcStack_4f38 = (code *)0x11ca55;
        fdb_doc_free((fdb_doc *)pfVar9);
        pfStack_4f18 = (fdb_kvs_handle *)0x0;
        uVar14 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar14;
        pcStack_4f38 = (code *)0x11ca6b;
        fVar2 = fdb_iterator_next(pfStack_4f10);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar14 != 10) goto LAB_0011cbbe;
      pcStack_4f38 = (code *)0x11ca88;
      fVar2 = fdb_iterator_close(pfStack_4f10);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc3;
      pcStack_4f38 = (code *)0x11ca9a;
      fVar2 = fdb_kvs_close(pfStack_4ef8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc8;
      pfVar34 = (fdb_kvs_handle *)&(pfVar34->kvs_config).field_0x1;
    } while (pfVar34 != (fdb_kvs_handle *)pcVar32);
    pcVar28 = (char *)0x0;
    do {
      pcStack_4f38 = (code *)0x11caba;
      fVar2 = fdb_kvs_close(apfStack_4ef0[(long)pcVar28]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbcd;
      pcVar28 = pcVar28 + 1;
    } while (pcVar32 != pcVar28);
    pcStack_4f38 = (code *)0x11cadd;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_4f20,pfStack_4f08[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbdc;
    pcStack_4f38 = (code *)0x11caf4;
    fVar2 = fdb_free_snap_markers(pfStack_4f08,uStack_4ed8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_4f38 = (code *)0x11cb06;
      fdb_close((fdb_file_handle *)pfStack_4f20);
      pcStack_4f38 = (code *)0x11cb0b;
      fdb_shutdown();
      pcStack_4f38 = (code *)0x11cb10;
      memleak_end();
      pcVar32 = "single kv mode:";
      if ((char)iStack_4efc != '\0') {
        pcVar32 = "multiple kv mode:";
      }
      pcStack_4f38 = (code *)0x11cb40;
      sprintf(acStack_4c50,"rollback without seqtree in %s",pcVar32);
      pcVar32 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar32 = "%s FAILED\n";
      }
      pcStack_4f38 = (code *)0x11cb6d;
      iVar4 = fprintf(_stderr,pcVar32,acStack_4c50);
      return iVar4;
    }
  }
  else {
LAB_0011cbd2:
    pcStack_4f38 = (code *)0x11cbd7;
    rollback_without_seqtree();
LAB_0011cbd7:
    pcStack_4f38 = (code *)0x11cbdc;
    rollback_without_seqtree();
LAB_0011cbdc:
    pcStack_4f38 = (code *)0x11cbe1;
    rollback_without_seqtree();
  }
  pcStack_4f38 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_5110 = (fdb_kvs_handle *)0x11cc03;
  pcStack_4f60 = pcVar28;
  aStack_4f58.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_4f50 = doc_00;
  pfStack_4f48 = pfVar9;
  pfStack_4f40 = pfVar34;
  pcStack_4f38 = (code *)pcVar32;
  gettimeofday(&tStack_50b0,(__timezone_ptr_t)0x0);
  pfStack_5110 = (fdb_kvs_handle *)0x11cc08;
  memleak_start();
  pfStack_5110 = (fdb_kvs_handle *)0x11cc14;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar32 = auStack_50a0 + 0x48;
  pfStack_5110 = (fdb_kvs_handle *)0x11cc24;
  fdb_get_default_config();
  pfStack_5110 = (fdb_kvs_handle *)0x11cc36;
  fVar2 = fdb_open(&pfStack_5108,"./mvcc_test2",(fdb_config *)pcVar32);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar32 = auStack_50a0;
    pfStack_5110 = (fdb_kvs_handle *)0x11cc4b;
    fdb_get_default_kvs_config();
    pbStack_50b8 = (btreeblk_handle *)auStack_50a0._16_8_;
    pfStack_50c8 = (filemgr *)auStack_50a0._0_8_;
    pdStack_50c0 = (docio_handle *)auStack_50a0._8_8_;
    pfStack_5110 = (fdb_kvs_handle *)0x11cc6c;
    fVar2 = fdb_kvs_open_default(pfStack_5108,&pfStack_5100,(fdb_kvs_config *)&pfStack_50c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf77;
    pfStack_5110 = (fdb_kvs_handle *)0x11cc82;
    fVar2 = fdb_begin_transaction(pfStack_5108,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf7c;
    pcVar32 = "key%d";
    pfVar9 = (fdb_kvs_handle *)acStack_50f7;
    pfVar34 = (fdb_kvs_handle *)0x1565bd;
    uVar5 = 0;
    do {
      pfStack_5110 = (fdb_kvs_handle *)0x11ccae;
      sprintf((char *)pfVar9,"key%d",uVar5);
      handle = pfStack_5100;
      pfStack_5110 = (fdb_kvs_handle *)0x11ccbb;
      sVar6 = strlen((char *)pfVar9);
      pfStack_5110 = (fdb_kvs_handle *)0x11ccd2;
      fVar2 = fdb_set_kv(handle,pfVar9,sVar6,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_5110 = (fdb_kvs_handle *)0x11cf63;
        tx_crash_recover_test();
        goto LAB_0011cf63;
      }
      uVar14 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar14;
    } while (uVar14 != 10);
    pfStack_5110 = (fdb_kvs_handle *)0x11ccef;
    fVar2 = fdb_end_transaction(pfStack_5108,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf81;
    pfStack_5110 = (fdb_kvs_handle *)0x11cd07;
    fdb_compact(pfStack_5108,"./mvcc_test3");
    pfStack_5110 = (fdb_kvs_handle *)0x11cd15;
    fVar2 = fdb_begin_transaction(pfStack_5108,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf86;
    pcVar32 = "key%d";
    pfVar9 = (fdb_kvs_handle *)acStack_50f7;
    uVar14 = 0;
    do {
      pfStack_5110 = (fdb_kvs_handle *)0x11cd3a;
      sprintf((char *)pfVar9,"key%d",(ulong)uVar14);
      pfVar34 = pfStack_5100;
      pfStack_5110 = (fdb_kvs_handle *)0x11cd47;
      sVar6 = strlen((char *)pfVar9);
      pfStack_5110 = (fdb_kvs_handle *)0x11cd55;
      fVar2 = fdb_del_kv(pfVar34,pfVar9,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf63;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 10);
    pfStack_5110 = (fdb_kvs_handle *)0x11cd72;
    fVar2 = fdb_get_file_info(pfStack_5108,(fdb_file_info *)auStack_50a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf8b;
    pcVar32 = (char *)((ulong)auStack_50a0._40_8_ / (ulong)uStack_5054);
    pfStack_5110 = (fdb_kvs_handle *)0x11cd9a;
    fdb_close(pfStack_5108);
    pfStack_5110 = (fdb_kvs_handle *)0x11cd9f;
    fdb_shutdown();
    pfStack_5110 = (fdb_kvs_handle *)0x11cdbe;
    iVar4 = _disk_dump("./mvcc_test3",(ulong)uStack_5054 * (long)pcVar32,
                       (ulong)((uStack_5054 >> 2) + uStack_5054 * 2));
    if (iVar4 < 0) goto LAB_0011cf90;
    pfStack_5110 = (fdb_kvs_handle *)0x11cde8;
    iVar4 = _disk_dump("./mvcc_test2",((long)pcVar32 * 4 + 8) * (ulong)uStack_5054,
                       (ulong)(uStack_5054 >> 2));
    if (iVar4 < 0) goto LAB_0011cf95;
    pfStack_5110 = (fdb_kvs_handle *)0x11ce07;
    fVar2 = fdb_open(&pfStack_5108,"./mvcc_test3",(fdb_config *)(auStack_50a0 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9a;
    pcVar32 = (char *)&pfStack_50e8;
    pfStack_5110 = (fdb_kvs_handle *)0x11ce1c;
    fdb_get_default_kvs_config();
    pbStack_50b8 = pbStack_50d8;
    pfStack_50c8 = pfStack_50e8;
    pdStack_50c0 = pdStack_50e0;
    pfStack_5110 = (fdb_kvs_handle *)0x11ce3d;
    fVar2 = fdb_kvs_open_default(pfStack_5108,&pfStack_5100,(fdb_kvs_config *)&pfStack_50c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9f;
    pfStack_5110 = (fdb_kvs_handle *)0x11ce53;
    fVar2 = fdb_begin_transaction(pfStack_5108,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar14 = 0;
      do {
        pfStack_5110 = (fdb_kvs_handle *)0x11ce78;
        sprintf(acStack_50f7,"key%d",(ulong)uVar14);
        pfVar34 = pfStack_5100;
        pfStack_5110 = (fdb_kvs_handle *)0x11ce85;
        sVar6 = strlen(acStack_50f7);
        pfStack_5110 = (fdb_kvs_handle *)0x11ce93;
        fVar2 = fdb_del_kv(pfVar34,acStack_50f7,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf68;
        uVar14 = uVar14 + 1;
      } while (uVar14 != 10);
      pfStack_5110 = (fdb_kvs_handle *)0x11ceab;
      fdb_abort_transaction(pfStack_5108);
      pfVar34 = (fdb_kvs_handle *)&pfStack_50e8;
      uVar14 = 0;
      while( true ) {
        pfStack_5110 = (fdb_kvs_handle *)0x11ced2;
        sprintf(acStack_50f7,"key%d",(ulong)uVar14);
        pfVar9 = pfStack_5100;
        pfStack_5110 = (fdb_kvs_handle *)0x11cedf;
        sVar6 = strlen(acStack_50f7);
        pfStack_5110 = (fdb_kvs_handle *)0x11cef3;
        fVar2 = fdb_get_kv(pfVar9,acStack_50f7,sVar6,(void **)pfVar34,&sStack_50d0);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_5110 = (fdb_kvs_handle *)0x11cf01;
        free(pfStack_50e8);
        uVar14 = uVar14 + 1;
        if (uVar14 == 10) {
          pfStack_5110 = (fdb_kvs_handle *)0x11cf11;
          fdb_close(pfStack_5108);
          pfStack_5110 = (fdb_kvs_handle *)0x11cf16;
          fdb_shutdown();
          pfStack_5110 = (fdb_kvs_handle *)0x11cf1b;
          memleak_end();
          pcVar32 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar32 = "%s FAILED\n";
          }
          pfStack_5110 = (fdb_kvs_handle *)0x11cf4c;
          iVar4 = fprintf(_stderr,pcVar32,"crash recover test");
          return iVar4;
        }
      }
LAB_0011cf6d:
      pfVar9 = (fdb_kvs_handle *)acStack_50f7;
      pcVar32 = "key%d";
      pfStack_5110 = (fdb_kvs_handle *)0x11cf72;
      tx_crash_recover_test();
      goto LAB_0011cf72;
    }
  }
  else {
LAB_0011cf72:
    pfStack_5110 = (fdb_kvs_handle *)0x11cf77;
    tx_crash_recover_test();
LAB_0011cf77:
    pfStack_5110 = (fdb_kvs_handle *)0x11cf7c;
    tx_crash_recover_test();
LAB_0011cf7c:
    pfStack_5110 = (fdb_kvs_handle *)0x11cf81;
    tx_crash_recover_test();
LAB_0011cf81:
    pfStack_5110 = (fdb_kvs_handle *)0x11cf86;
    tx_crash_recover_test();
LAB_0011cf86:
    pfStack_5110 = (fdb_kvs_handle *)0x11cf8b;
    tx_crash_recover_test();
LAB_0011cf8b:
    pfStack_5110 = (fdb_kvs_handle *)0x11cf90;
    tx_crash_recover_test();
LAB_0011cf90:
    pfStack_5110 = (fdb_kvs_handle *)0x11cf95;
    tx_crash_recover_test();
LAB_0011cf95:
    pfStack_5110 = (fdb_kvs_handle *)0x11cf9a;
    tx_crash_recover_test();
LAB_0011cf9a:
    pfStack_5110 = (fdb_kvs_handle *)0x11cf9f;
    tx_crash_recover_test();
LAB_0011cf9f:
    pfStack_5110 = (fdb_kvs_handle *)0x11cfa4;
    tx_crash_recover_test();
  }
  pfStack_5110 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_5120 = (fdb_config *)pcVar32;
  pfStack_5118 = pfVar9;
  pfStack_5110 = pfVar34;
  gettimeofday(&tStack_5240,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_5250 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_5260,"./mvcc_test1",&fStack_5218);
  fdb_kvs_open_default(pfStack_5260,&pfStack_5248,&fStack_5230);
  fdb_kvs_open(pfStack_5260,&pfStack_5268,"kv",&fStack_5230);
  fVar2 = fdb_set_kv(pfStack_5268,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_5268,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c2;
    fdb_commit(pfStack_5260,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_5268,&pfStack_5270,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c9;
    fVar2 = fdb_iterator_init(pfStack_5270,&pfStack_5258,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ce;
    fVar2 = fdb_kvs_close(pfStack_5270);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1d3;
    fVar2 = fdb_kvs_close(pfStack_5268);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1d8;
    fVar2 = fdb_kvs_remove(pfStack_5260,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1dd;
    fVar2 = fdb_iterator_get(pfStack_5258,&pfStack_5250);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e2;
    fdb_doc_free(pfStack_5250);
    fVar2 = fdb_iterator_close(pfStack_5258);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e7;
    fVar2 = fdb_kvs_close(pfStack_5270);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ec;
    fVar2 = fdb_kvs_close(pfStack_5248);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_5260);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar32 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar32 = "%s FAILED\n";
        }
        iVar4 = fprintf(_stderr,pcVar32,"drop kv other handle test");
        return iVar4;
      }
      goto LAB_0011d1f6;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d1c2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1c9:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ce:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d3:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d8:
    drop_kv_on_snap_iterator_test();
LAB_0011d1dd:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e7:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ec:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d1f6:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return 0;
}

Assistant:

static fdb_compact_decision cb_snapshot(fdb_file_handle *fhandle,
        fdb_compaction_status status, const char *kv_name,
        fdb_doc *doc, uint64_t old_offset, uint64_t new_offset,
        void *ctx)
{
    struct cb_snapshot_args *args = (struct cb_snapshot_args *)ctx;
    TEST_INIT();

    if (--args->niterations >= 0) {
        TEST_CHK(!kv_name);
        if (status == FDB_CS_BEGIN) {
            // first verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
            // update half docs
            _snapshot_update_docs(fhandle, args);
            // second verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
        } else { // if (status == FDB_CS_END)
            // first verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
            // update half docs
            _snapshot_update_docs(fhandle, args);
            // second verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
        }
    }
    return 0;
}